

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  Primitive PVar5;
  uint uVar6;
  undefined4 uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  RTCRayQueryContext *pRVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [12];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  byte bVar62;
  byte bVar63;
  ulong uVar64;
  byte bVar65;
  uint uVar66;
  byte bVar67;
  byte bVar68;
  ulong uVar69;
  uint uVar70;
  long lVar71;
  bool bVar72;
  ulong uVar73;
  uint uVar133;
  uint uVar134;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  uint uVar135;
  uint uVar136;
  uint uVar137;
  uint uVar138;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar127 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar132 [32];
  uint uVar139;
  float fVar140;
  undefined4 uVar141;
  vint4 bi_2;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  vint4 bi_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  vint4 bi;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  vint4 ai_2;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar221;
  float fVar224;
  float fVar225;
  vint4 ai;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  vint4 ai_1;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar236;
  undefined1 auVar235 [32];
  float fVar237;
  float fVar241;
  float fVar242;
  undefined1 auVar238 [16];
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar247;
  float fVar252;
  undefined1 auVar248 [16];
  float fVar250;
  float fVar251;
  undefined1 auVar249 [64];
  float t;
  float fVar253;
  float fVar258;
  undefined1 auVar254 [16];
  float fVar256;
  float fVar257;
  undefined1 auVar255 [64];
  float s;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  float s_1;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [16];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  float local_a00;
  RTCFilterFunctionNArguments local_970;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 (*local_8e8) [32];
  Primitive *local_8e0;
  ulong local_8d8;
  ulong local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  RTCHitN local_560 [32];
  undefined1 local_540 [32];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  uint local_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  uint local_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 uStack_140;
  float afStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar128 [32];
  undefined1 auVar131 [32];
  
  PVar5 = prim[1];
  uVar69 = (ulong)(byte)PVar5;
  fVar140 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar77 = vsubps_avx(auVar77,*(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  auVar197._0_4_ = fVar140 * auVar77._0_4_;
  auVar197._4_4_ = fVar140 * auVar77._4_4_;
  auVar197._8_4_ = fVar140 * auVar77._8_4_;
  auVar197._12_4_ = fVar140 * auVar77._12_4_;
  auVar83._0_4_ = fVar140 * auVar75._0_4_;
  auVar83._4_4_ = fVar140 * auVar75._4_4_;
  auVar83._8_4_ = fVar140 * auVar75._8_4_;
  auVar83._12_4_ = fVar140 * auVar75._12_4_;
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xb + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6)));
  auVar182 = vcvtdq2ps_avx(auVar182);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar5 * 0xc + uVar69 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  uVar73 = (ulong)(uint)((int)(uVar69 * 9) * 2);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 + uVar69 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar262 = ZEXT1664(auVar81);
  uVar64 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar264._4_4_ = auVar83._0_4_;
  auVar264._0_4_ = auVar83._0_4_;
  auVar264._8_4_ = auVar83._0_4_;
  auVar264._12_4_ = auVar83._0_4_;
  auVar254 = vshufps_avx(auVar83,auVar83,0x55);
  auVar76 = vshufps_avx(auVar83,auVar83,0xaa);
  fVar140 = auVar76._0_4_;
  auVar180._0_4_ = fVar140 * auVar78._0_4_;
  fVar247 = auVar76._4_4_;
  auVar180._4_4_ = fVar247 * auVar78._4_4_;
  fVar250 = auVar76._8_4_;
  auVar180._8_4_ = fVar250 * auVar78._8_4_;
  fVar251 = auVar76._12_4_;
  auVar180._12_4_ = fVar251 * auVar78._12_4_;
  auVar160._0_4_ = auVar79._0_4_ * fVar140;
  auVar160._4_4_ = auVar79._4_4_ * fVar247;
  auVar160._8_4_ = auVar79._8_4_ * fVar250;
  auVar160._12_4_ = auVar79._12_4_ * fVar251;
  auVar85._0_4_ = auVar82._0_4_ * fVar140;
  auVar85._4_4_ = auVar82._4_4_ * fVar247;
  auVar85._8_4_ = auVar82._8_4_ * fVar250;
  auVar85._12_4_ = auVar82._12_4_ * fVar251;
  auVar76 = vfmadd231ps_fma(auVar180,auVar254,auVar75);
  auVar74 = vfmadd231ps_fma(auVar160,auVar254,auVar182);
  auVar254 = vfmadd231ps_fma(auVar85,auVar81,auVar254);
  auVar84 = vfmadd231ps_fma(auVar76,auVar264,auVar77);
  auVar74 = vfmadd231ps_fma(auVar74,auVar264,auVar80);
  auVar83 = vfmadd231ps_fma(auVar254,auVar87,auVar264);
  auVar265._4_4_ = auVar197._0_4_;
  auVar265._0_4_ = auVar197._0_4_;
  auVar265._8_4_ = auVar197._0_4_;
  auVar265._12_4_ = auVar197._0_4_;
  auVar254 = vshufps_avx(auVar197,auVar197,0x55);
  auVar76 = vshufps_avx(auVar197,auVar197,0xaa);
  fVar140 = auVar76._0_4_;
  auVar271._0_4_ = fVar140 * auVar78._0_4_;
  fVar247 = auVar76._4_4_;
  auVar271._4_4_ = fVar247 * auVar78._4_4_;
  fVar250 = auVar76._8_4_;
  auVar271._8_4_ = fVar250 * auVar78._8_4_;
  fVar251 = auVar76._12_4_;
  auVar271._12_4_ = fVar251 * auVar78._12_4_;
  auVar211._0_4_ = auVar79._0_4_ * fVar140;
  auVar211._4_4_ = auVar79._4_4_ * fVar247;
  auVar211._8_4_ = auVar79._8_4_ * fVar250;
  auVar211._12_4_ = auVar79._12_4_ * fVar251;
  auVar198._0_4_ = auVar82._0_4_ * fVar140;
  auVar198._4_4_ = auVar82._4_4_ * fVar247;
  auVar198._8_4_ = auVar82._8_4_ * fVar250;
  auVar198._12_4_ = auVar82._12_4_ * fVar251;
  auVar75 = vfmadd231ps_fma(auVar271,auVar254,auVar75);
  auVar78 = vfmadd231ps_fma(auVar211,auVar254,auVar182);
  auVar182 = vfmadd231ps_fma(auVar198,auVar254,auVar81);
  auVar79 = vfmadd231ps_fma(auVar75,auVar265,auVar77);
  auVar81 = vfmadd231ps_fma(auVar78,auVar265,auVar80);
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar82 = vfmadd231ps_fma(auVar182,auVar265,auVar87);
  auVar77 = vandps_avx(auVar84,auVar238);
  auVar230._8_4_ = 0x219392ef;
  auVar230._0_8_ = 0x219392ef219392ef;
  auVar230._12_4_ = 0x219392ef;
  uVar73 = vcmpps_avx512vl(auVar77,auVar230,1);
  bVar11 = (bool)((byte)uVar73 & 1);
  auVar76._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar84._0_4_;
  bVar11 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar84._4_4_;
  bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar84._8_4_;
  bVar11 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar84._12_4_;
  auVar77 = vandps_avx(auVar74,auVar238);
  uVar73 = vcmpps_avx512vl(auVar77,auVar230,1);
  bVar11 = (bool)((byte)uVar73 & 1);
  auVar84._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar74._0_4_;
  bVar11 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar74._4_4_;
  bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar74._8_4_;
  bVar11 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar74._12_4_;
  auVar77 = vandps_avx(auVar83,auVar238);
  uVar73 = vcmpps_avx512vl(auVar77,auVar230,1);
  bVar11 = (bool)((byte)uVar73 & 1);
  auVar74._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar83._0_4_;
  bVar11 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar83._4_4_;
  bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar83._8_4_;
  bVar11 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar83._12_4_;
  auVar75 = vrcp14ps_avx512vl(auVar76);
  auVar231._8_4_ = 0x3f800000;
  auVar231._0_8_ = &DAT_3f8000003f800000;
  auVar231._12_4_ = 0x3f800000;
  auVar77 = vfnmadd213ps_fma(auVar76,auVar75,auVar231);
  auVar80 = vfmadd132ps_fma(auVar77,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar84);
  auVar77 = vfnmadd213ps_fma(auVar84,auVar75,auVar231);
  auVar182 = vfmadd132ps_fma(auVar77,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar74);
  auVar77 = vfnmadd213ps_fma(auVar74,auVar75,auVar231);
  auVar87 = vfmadd132ps_fma(auVar77,auVar75,auVar75);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar77 = vpmovsxwd_avx(auVar77);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar79);
  auVar222._0_4_ = auVar80._0_4_ * auVar77._0_4_;
  auVar222._4_4_ = auVar80._4_4_ * auVar77._4_4_;
  auVar222._8_4_ = auVar80._8_4_ * auVar77._8_4_;
  auVar222._12_4_ = auVar80._12_4_ * auVar77._12_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar77 = vpmovsxwd_avx(auVar75);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar79);
  auVar76 = vpbroadcastd_avx512vl();
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar75 = vpmovsxwd_avx(auVar78);
  auVar181._0_4_ = auVar80._0_4_ * auVar77._0_4_;
  auVar181._4_4_ = auVar80._4_4_ * auVar77._4_4_;
  auVar181._8_4_ = auVar80._8_4_ * auVar77._8_4_;
  auVar181._12_4_ = auVar80._12_4_ * auVar77._12_4_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar69 * -2 + 6);
  auVar77 = vpmovsxwd_avx(auVar80);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar81);
  auVar232._0_4_ = auVar182._0_4_ * auVar77._0_4_;
  auVar232._4_4_ = auVar182._4_4_ * auVar77._4_4_;
  auVar232._8_4_ = auVar182._8_4_ * auVar77._8_4_;
  auVar232._12_4_ = auVar182._12_4_ * auVar77._12_4_;
  auVar77 = vcvtdq2ps_avx(auVar75);
  auVar77 = vsubps_avx(auVar77,auVar81);
  auVar161._0_4_ = auVar182._0_4_ * auVar77._0_4_;
  auVar161._4_4_ = auVar182._4_4_ * auVar77._4_4_;
  auVar161._8_4_ = auVar182._8_4_ * auVar77._8_4_;
  auVar161._12_4_ = auVar182._12_4_ * auVar77._12_4_;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar64 + uVar69 + 6);
  auVar77 = vpmovsxwd_avx(auVar182);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar82);
  auVar212._0_4_ = auVar87._0_4_ * auVar77._0_4_;
  auVar212._4_4_ = auVar87._4_4_ * auVar77._4_4_;
  auVar212._8_4_ = auVar87._8_4_ * auVar77._8_4_;
  auVar212._12_4_ = auVar87._12_4_ * auVar77._12_4_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar69 * 0x17 + 6);
  auVar77 = vpmovsxwd_avx(auVar79);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar82);
  auVar86._0_4_ = auVar87._0_4_ * auVar77._0_4_;
  auVar86._4_4_ = auVar87._4_4_ * auVar77._4_4_;
  auVar86._8_4_ = auVar87._8_4_ * auVar77._8_4_;
  auVar86._12_4_ = auVar87._12_4_ * auVar77._12_4_;
  auVar77 = vpminsd_avx(auVar222,auVar181);
  auVar75 = vpminsd_avx(auVar232,auVar161);
  auVar77 = vmaxps_avx(auVar77,auVar75);
  auVar75 = vpminsd_avx(auVar212,auVar86);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar87._4_4_ = uVar141;
  auVar87._0_4_ = uVar141;
  auVar87._8_4_ = uVar141;
  auVar87._12_4_ = uVar141;
  auVar75 = vmaxps_avx512vl(auVar75,auVar87);
  auVar77 = vmaxps_avx(auVar77,auVar75);
  auVar81._8_4_ = 0x3f7ffffa;
  auVar81._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar81._12_4_ = 0x3f7ffffa;
  local_630 = vmulps_avx512vl(auVar77,auVar81);
  auVar77 = vpmaxsd_avx(auVar222,auVar181);
  auVar75 = vpmaxsd_avx(auVar232,auVar161);
  auVar77 = vminps_avx(auVar77,auVar75);
  auVar75 = vpmaxsd_avx(auVar212,auVar86);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar82._4_4_ = uVar141;
  auVar82._0_4_ = uVar141;
  auVar82._8_4_ = uVar141;
  auVar82._12_4_ = uVar141;
  auVar75 = vminps_avx512vl(auVar75,auVar82);
  auVar77 = vminps_avx(auVar77,auVar75);
  auVar254._8_4_ = 0x3f800003;
  auVar254._0_8_ = 0x3f8000033f800003;
  auVar254._12_4_ = 0x3f800003;
  auVar77 = vmulps_avx512vl(auVar77,auVar254);
  uVar18 = vcmpps_avx512vl(local_630,auVar77,2);
  local_8c8 = vpcmpgtd_avx512vl(auVar76,_DAT_01ff0cf0);
  local_8c8 = ((byte)uVar18 & 0xf) & local_8c8;
  if ((char)local_8c8 == '\0') {
    return;
  }
  local_8e8 = (undefined1 (*) [32])&local_480;
  local_620 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar249 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  auVar255 = ZEXT3264(_DAT_02020f20);
  auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar275 = ZEXT3264(auVar88);
  local_8e0 = prim;
LAB_01b52608:
  lVar71 = 0;
  for (uVar73 = local_8c8; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
    lVar71 = lVar71 + 1;
  }
  uVar70 = *(uint *)(prim + 2);
  uVar6 = *(uint *)(prim + lVar71 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar70].ptr;
  uVar73 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar6);
  p_Var9 = pGVar8[1].intersectionFilterN;
  lVar71 = *(long *)&pGVar8[1].time_range.upper;
  auVar77 = *(undefined1 (*) [16])(lVar71 + (long)p_Var9 * uVar73);
  auVar75 = *(undefined1 (*) [16])(lVar71 + (uVar73 + 1) * (long)p_Var9);
  local_8c8 = local_8c8 - 1 & local_8c8;
  if (local_8c8 != 0) {
    uVar69 = local_8c8 - 1 & local_8c8;
    for (uVar64 = local_8c8; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
    }
    if (uVar69 != 0) {
      for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar80 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar263._4_4_ = uVar141;
  auVar263._0_4_ = uVar141;
  auVar263._8_4_ = uVar141;
  auVar263._12_4_ = uVar141;
  local_780._16_4_ = uVar141;
  local_780._0_16_ = auVar263;
  local_780._20_4_ = uVar141;
  local_780._24_4_ = uVar141;
  local_780._28_4_ = uVar141;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar78 = vunpcklps_avx512vl(auVar263,auVar88._0_16_);
  local_8c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar274 = ZEXT3264(local_8c0);
  auVar87 = local_8c0._0_16_;
  local_890 = vinsertps_avx512f(auVar78,auVar87,0x28);
  auVar269 = ZEXT1664(local_890);
  auVar223._0_4_ = auVar77._0_4_ + auVar75._0_4_;
  auVar223._4_4_ = auVar77._4_4_ + auVar75._4_4_;
  auVar223._8_4_ = auVar77._8_4_ + auVar75._8_4_;
  auVar223._12_4_ = auVar77._12_4_ + auVar75._12_4_;
  auVar21._8_4_ = 0x3f000000;
  auVar21._0_8_ = 0x3f0000003f000000;
  auVar21._12_4_ = 0x3f000000;
  auVar78 = vmulps_avx512vl(auVar223,auVar21);
  auVar78 = vsubps_avx(auVar78,auVar80);
  auVar78 = vdpps_avx(auVar78,local_890,0x7f);
  fVar140 = *(float *)(ray + k * 4 + 0x60);
  auVar270 = ZEXT464((uint)fVar140);
  local_8a0 = vdpps_avx(local_890,local_890,0x7f);
  auVar272 = ZEXT1664(local_8a0);
  auVar233._4_12_ = ZEXT812(0) << 0x20;
  auVar233._0_4_ = local_8a0._0_4_;
  auVar79 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar233);
  auVar182 = vfnmadd213ss_fma(auVar79,local_8a0,ZEXT416(0x40000000));
  local_3e0 = auVar78._0_4_ * auVar79._0_4_ * auVar182._0_4_;
  auVar234._4_4_ = local_3e0;
  auVar234._0_4_ = local_3e0;
  auVar234._8_4_ = local_3e0;
  auVar234._12_4_ = local_3e0;
  fStack_730 = local_3e0;
  _local_740 = auVar234;
  fStack_72c = local_3e0;
  fStack_728 = local_3e0;
  fStack_724 = local_3e0;
  auVar78 = vfmadd231ps_fma(auVar80,local_890,auVar234);
  auVar78 = vblendps_avx(auVar78,ZEXT816(0) << 0x40,8);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar71 + (uVar73 + 2) * (long)p_Var9),auVar78);
  auVar75 = vsubps_avx(auVar75,auVar78);
  auVar78 = vsubps_avx(*(undefined1 (*) [16])(lVar71 + (uVar73 + 3) * (long)p_Var9),auVar78);
  local_1e0 = auVar77._0_4_;
  fStack_1dc = local_1e0;
  fStack_1d8 = local_1e0;
  fStack_1d4 = local_1e0;
  fStack_1d0 = local_1e0;
  fStack_1cc = local_1e0;
  fStack_1c8 = local_1e0;
  fStack_1c4 = local_1e0;
  auVar89._8_4_ = 1;
  auVar89._0_8_ = 0x100000001;
  auVar89._12_4_ = 1;
  auVar89._16_4_ = 1;
  auVar89._20_4_ = 1;
  auVar89._24_4_ = 1;
  auVar89._28_4_ = 1;
  local_820 = ZEXT1632(auVar77);
  local_200 = vpermps_avx2(auVar89,local_820);
  auVar90._8_4_ = 2;
  auVar90._0_8_ = 0x200000002;
  auVar90._12_4_ = 2;
  auVar90._16_4_ = 2;
  auVar90._20_4_ = 2;
  auVar90._24_4_ = 2;
  auVar90._28_4_ = 2;
  local_220 = vpermps_avx2(auVar90,local_820);
  auVar91._8_4_ = 3;
  auVar91._0_8_ = 0x300000003;
  auVar91._12_4_ = 3;
  auVar91._16_4_ = 3;
  auVar91._20_4_ = 3;
  auVar91._24_4_ = 3;
  auVar91._28_4_ = 3;
  local_240 = vpermps_avx2(auVar91,local_820);
  local_260 = auVar75._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_860 = ZEXT1632(auVar75);
  local_280 = vpermps_avx2(auVar89,local_860);
  local_2a0 = vpermps_avx2(auVar90,local_860);
  local_2c0 = vpermps_avx2(auVar91,local_860);
  local_2e0 = auVar80._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_840 = ZEXT1632(auVar80);
  local_300 = vpermps_avx2(auVar89,local_840);
  local_320 = vpermps_avx2(auVar90,local_840);
  local_340 = vpermps_avx2(auVar91,local_840);
  local_360 = auVar78._0_4_;
  uStack_35c = local_360;
  uStack_358 = local_360;
  uStack_354 = local_360;
  uStack_350 = local_360;
  uStack_34c = local_360;
  uStack_348 = local_360;
  uStack_344 = local_360;
  _local_880 = ZEXT1632(auVar78);
  local_380 = vpermps_avx2(auVar89,_local_880);
  local_3a0 = vpermps_avx2(auVar90,_local_880);
  _local_580 = vpermps_avx2(auVar91,_local_880);
  auVar77 = vmulss_avx512f(auVar87,auVar87);
  auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar88,auVar88);
  auVar77 = vfmadd231ps_fma(auVar89,local_780,local_780);
  local_3c0._0_4_ = auVar77._0_4_;
  local_3c0._4_4_ = local_3c0._0_4_;
  local_3c0._8_4_ = local_3c0._0_4_;
  local_3c0._12_4_ = local_3c0._0_4_;
  local_3c0._16_4_ = local_3c0._0_4_;
  local_3c0._20_4_ = local_3c0._0_4_;
  local_3c0._24_4_ = local_3c0._0_4_;
  local_3c0._28_4_ = local_3c0._0_4_;
  local_5a0 = vandps_avx(auVar249._0_32_,local_3c0);
  local_7c0 = ZEXT416((uint)local_3e0);
  local_3e0 = fVar140 - local_3e0;
  fStack_3dc = local_3e0;
  fStack_3d8 = local_3e0;
  fStack_3d4 = local_3e0;
  fStack_3d0 = local_3e0;
  fStack_3cc = local_3e0;
  fStack_3c8 = local_3e0;
  fStack_3c4 = local_3e0;
  local_5e0 = vpbroadcastd_avx512vl();
  local_8d8 = 1;
  local_8d0 = 0;
  local_600 = vpbroadcastd_avx512vl();
  auVar77 = vsqrtss_avx(local_8a0,local_8a0);
  auVar75 = vsqrtss_avx(local_8a0,local_8a0);
  auVar196 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    auVar182 = auVar196._0_16_;
    auVar78 = vmovshdup_avx(auVar182);
    fVar250 = auVar196._0_4_;
    fVar247 = auVar78._0_4_ - fVar250;
    fVar236 = fVar247 * 0.04761905;
    auVar217._4_4_ = fVar250;
    auVar217._0_4_ = fVar250;
    auVar217._8_4_ = fVar250;
    auVar217._12_4_ = fVar250;
    auVar217._16_4_ = fVar250;
    auVar217._20_4_ = fVar250;
    auVar217._24_4_ = fVar250;
    auVar217._28_4_ = fVar250;
    auVar150._4_4_ = fVar247;
    auVar150._0_4_ = fVar247;
    auVar150._8_4_ = fVar247;
    auVar150._12_4_ = fVar247;
    auVar150._16_4_ = fVar247;
    auVar150._20_4_ = fVar247;
    auVar150._24_4_ = fVar247;
    auVar150._28_4_ = fVar247;
    auVar78 = vfmadd231ps_fma(auVar217,auVar150,auVar255._0_32_);
    auVar90 = vsubps_avx512vl(auVar275._0_32_,ZEXT1632(auVar78));
    auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar91 = vxorps_avx512vl(ZEXT1632(auVar78),auVar89);
    fVar237 = auVar90._0_4_;
    fVar241 = auVar90._4_4_;
    fVar242 = auVar90._8_4_;
    fVar243 = auVar90._12_4_;
    fVar244 = auVar90._16_4_;
    fVar245 = auVar90._20_4_;
    fVar246 = auVar90._24_4_;
    fVar247 = auVar78._0_4_;
    fVar250 = auVar78._4_4_;
    fVar251 = auVar78._8_4_;
    fVar252 = auVar78._12_4_;
    auVar249._0_28_ =
         ZEXT1628(CONCAT412(fVar252 * fVar252,
                            CONCAT48(fVar251 * fVar251,CONCAT44(fVar250 * fVar250,fVar247 * fVar247)
                                    )));
    fVar253 = fVar247 * 3.0;
    fVar256 = fVar250 * 3.0;
    fVar257 = fVar251 * 3.0;
    fVar258 = fVar252 * 3.0;
    auVar275._28_36_ = auVar255._28_36_;
    auVar275._0_28_ = ZEXT1628(CONCAT412(fVar258,CONCAT48(fVar257,CONCAT44(fVar256,fVar253))));
    auVar196._0_4_ = fVar237 * fVar237;
    auVar196._4_4_ = fVar241 * fVar241;
    auVar196._8_4_ = fVar242 * fVar242;
    auVar196._12_4_ = fVar243 * fVar243;
    auVar196._16_4_ = fVar244 * fVar244;
    auVar196._20_4_ = fVar245 * fVar245;
    auVar196._28_36_ = auVar262._28_36_;
    auVar196._24_4_ = fVar246 * fVar246;
    auVar89 = vxorps_avx512vl(auVar90,auVar89);
    auVar262._0_4_ = fVar237 * fVar237 * auVar91._0_4_ * 0.5;
    auVar262._4_4_ = fVar241 * fVar241 * auVar91._4_4_ * 0.5;
    auVar262._8_4_ = fVar242 * fVar242 * auVar91._8_4_ * 0.5;
    auVar262._12_4_ = fVar243 * fVar243 * auVar91._12_4_ * 0.5;
    auVar262._16_4_ = fVar244 * fVar244 * auVar91._16_4_ * 0.5;
    auVar262._20_4_ = fVar245 * fVar245 * auVar91._20_4_ * 0.5;
    auVar262._28_36_ = auVar269._28_36_;
    auVar262._24_4_ = fVar246 * fVar246 * auVar91._24_4_ * 0.5;
    auVar95 = auVar262._0_32_;
    auVar269._0_4_ = (fVar247 * fVar247 * (fVar253 + -5.0) + 2.0) * 0.5;
    auVar269._4_4_ = (fVar250 * fVar250 * (fVar256 + -5.0) + 2.0) * 0.5;
    auVar269._8_4_ = (fVar251 * fVar251 * (fVar257 + -5.0) + 2.0) * 0.5;
    auVar269._12_4_ = (fVar252 * fVar252 * (fVar258 + -5.0) + 2.0) * 0.5;
    auVar269._16_4_ = 0x3f800000;
    auVar269._20_4_ = 0x3f800000;
    auVar269._28_36_ = auVar270._28_36_;
    auVar269._24_4_ = 0x3f800000;
    auVar102 = auVar269._0_32_;
    auVar273._0_4_ = (auVar196._0_4_ * (fVar237 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar273._4_4_ = (auVar196._4_4_ * (fVar241 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar273._8_4_ = (auVar196._8_4_ * (fVar242 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar273._12_4_ = (auVar196._12_4_ * (fVar243 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar273._16_4_ = (auVar196._16_4_ * (fVar244 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar273._20_4_ = (auVar196._20_4_ * (fVar245 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar273._28_36_ = auVar272._28_36_;
    auVar273._24_4_ = (auVar196._24_4_ * (fVar246 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar103 = auVar273._0_32_;
    fVar221 = fVar247 * fVar247 * auVar89._0_4_ * 0.5;
    fVar224 = fVar250 * fVar250 * auVar89._4_4_ * 0.5;
    auVar94._4_4_ = fVar224;
    auVar94._0_4_ = fVar221;
    fVar225 = fVar251 * fVar251 * auVar89._8_4_ * 0.5;
    auVar94._8_4_ = fVar225;
    fVar226 = fVar252 * fVar252 * auVar89._12_4_ * 0.5;
    auVar94._12_4_ = fVar226;
    fVar227 = auVar89._16_4_ * 0.0 * 0.0 * 0.5;
    auVar94._16_4_ = fVar227;
    fVar228 = auVar89._20_4_ * 0.0 * 0.0 * 0.5;
    auVar94._20_4_ = fVar228;
    fVar229 = auVar89._24_4_ * 0.0 * 0.0 * 0.5;
    auVar94._24_4_ = fVar229;
    auVar94._28_4_ = auVar89._28_4_;
    auVar58._4_4_ = uStack_35c;
    auVar58._0_4_ = local_360;
    auVar58._8_4_ = uStack_358;
    auVar58._12_4_ = uStack_354;
    auVar118._16_4_ = uStack_350;
    auVar118._0_16_ = auVar58;
    auVar118._20_4_ = uStack_34c;
    auVar118._24_4_ = uStack_348;
    auVar118._28_4_ = uStack_344;
    auVar91 = vmulps_avx512vl(auVar118,auVar94);
    auVar92 = vmulps_avx512vl(local_380,auVar94);
    auVar93 = vmulps_avx512vl(local_3a0,auVar94);
    auVar96._4_4_ = fVar224 * (float)local_580._4_4_;
    auVar96._0_4_ = fVar221 * (float)local_580._0_4_;
    auVar96._8_4_ = fVar225 * fStack_578;
    auVar96._12_4_ = fVar226 * fStack_574;
    auVar96._16_4_ = fVar227 * fStack_570;
    auVar96._20_4_ = fVar228 * fStack_56c;
    auVar96._24_4_ = fVar229 * fStack_568;
    auVar96._28_4_ = auVar89._28_4_;
    auVar119._4_4_ = uStack_2dc;
    auVar119._0_4_ = local_2e0;
    auVar119._8_4_ = uStack_2d8;
    auVar119._12_4_ = uStack_2d4;
    auVar119._16_4_ = uStack_2d0;
    auVar119._20_4_ = uStack_2cc;
    auVar119._24_4_ = uStack_2c8;
    auVar119._28_4_ = uStack_2c4;
    auVar89 = vfmadd231ps_avx512vl(auVar91,auVar103,auVar119);
    auVar91 = vfmadd231ps_avx512vl(auVar92,auVar103,local_300);
    auVar92 = vfmadd231ps_avx512vl(auVar93,auVar103,local_320);
    auVar93 = vfmadd231ps_avx512vl(auVar96,local_340,auVar103);
    auVar59._4_4_ = uStack_25c;
    auVar59._0_4_ = local_260;
    auVar59._8_4_ = uStack_258;
    auVar59._12_4_ = uStack_254;
    auVar59._16_4_ = uStack_250;
    auVar59._20_4_ = uStack_24c;
    auVar59._24_4_ = uStack_248;
    auVar59._28_4_ = uStack_244;
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar102,auVar59);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar102,local_280);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar102,local_2a0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,local_2c0,auVar102);
    auVar60._4_4_ = fStack_1dc;
    auVar60._0_4_ = local_1e0;
    auVar60._8_4_ = fStack_1d8;
    auVar60._12_4_ = fStack_1d4;
    auVar60._16_4_ = fStack_1d0;
    auVar60._20_4_ = fStack_1cc;
    auVar60._24_4_ = fStack_1c8;
    auVar60._28_4_ = fStack_1c4;
    auVar78 = vfmadd231ps_fma(auVar89,auVar95,auVar60);
    local_920 = vfmadd231ps_avx512vl(auVar91,auVar95,local_200);
    auVar94 = vfmadd231ps_avx512vl(auVar92,auVar95,local_220);
    auVar93 = vfmadd231ps_avx512vl(auVar93,local_240,auVar95);
    auVar97._4_4_ = (fVar241 + fVar241) * fVar250;
    auVar97._0_4_ = (fVar237 + fVar237) * fVar247;
    auVar97._8_4_ = (fVar242 + fVar242) * fVar251;
    auVar97._12_4_ = (fVar243 + fVar243) * fVar252;
    auVar97._16_4_ = (fVar244 + fVar244) * 0.0;
    auVar97._20_4_ = (fVar245 + fVar245) * 0.0;
    auVar97._24_4_ = (fVar246 + fVar246) * 0.0;
    auVar97._28_4_ = auVar270._28_4_;
    auVar89 = vsubps_avx(auVar97,auVar196._0_32_);
    auVar92._8_4_ = 0x40000000;
    auVar92._0_8_ = 0x4000000040000000;
    auVar92._12_4_ = 0x40000000;
    auVar92._16_4_ = 0x40000000;
    auVar92._20_4_ = 0x40000000;
    auVar92._24_4_ = 0x40000000;
    auVar92._28_4_ = 0x40000000;
    auVar92 = vaddps_avx512vl(auVar275._0_32_,auVar92);
    auVar98._4_4_ = (fVar241 + fVar241) * auVar92._4_4_;
    auVar98._0_4_ = (fVar237 + fVar237) * auVar92._0_4_;
    auVar98._8_4_ = (fVar242 + fVar242) * auVar92._8_4_;
    auVar98._12_4_ = (fVar243 + fVar243) * auVar92._12_4_;
    auVar98._16_4_ = (fVar244 + fVar244) * auVar92._16_4_;
    auVar98._20_4_ = (fVar245 + fVar245) * auVar92._20_4_;
    auVar98._24_4_ = (fVar246 + fVar246) * auVar92._24_4_;
    auVar98._28_4_ = auVar92._28_4_;
    auVar99._4_4_ = fVar241 * 3.0 * fVar241;
    auVar99._0_4_ = fVar237 * 3.0 * fVar237;
    auVar99._8_4_ = fVar242 * 3.0 * fVar242;
    auVar99._12_4_ = fVar243 * 3.0 * fVar243;
    auVar99._16_4_ = fVar244 * 3.0 * fVar244;
    auVar99._20_4_ = fVar245 * 3.0 * fVar245;
    auVar99._24_4_ = fVar246 * 3.0 * fVar246;
    auVar99._28_4_ = auVar90._28_4_;
    auVar90 = vsubps_avx(auVar98,auVar99);
    auVar91 = vsubps_avx(auVar249._0_32_,auVar97);
    auVar100._4_4_ = auVar89._4_4_ * 0.5;
    auVar100._0_4_ = auVar89._0_4_ * 0.5;
    auVar100._8_4_ = auVar89._8_4_ * 0.5;
    auVar100._12_4_ = auVar89._12_4_ * 0.5;
    auVar100._16_4_ = auVar89._16_4_ * 0.5;
    auVar100._20_4_ = auVar89._20_4_ * 0.5;
    auVar100._24_4_ = auVar89._24_4_ * 0.5;
    auVar100._28_4_ = auVar92._28_4_;
    auVar101._28_4_ = auVar255._28_4_ + -5.0 + 0.0;
    auVar101._0_28_ =
         ZEXT1628(CONCAT412(((fVar252 + fVar252) * (fVar258 + -5.0) + fVar258 * fVar252) * 0.5,
                            CONCAT48(((fVar251 + fVar251) * (fVar257 + -5.0) + fVar257 * fVar251) *
                                     0.5,CONCAT44(((fVar250 + fVar250) * (fVar256 + -5.0) +
                                                  fVar256 * fVar250) * 0.5,
                                                  ((fVar247 + fVar247) * (fVar253 + -5.0) +
                                                  fVar253 * fVar247) * 0.5))));
    auVar106._4_4_ = auVar90._4_4_ * 0.5;
    auVar106._0_4_ = auVar90._0_4_ * 0.5;
    auVar106._8_4_ = auVar90._8_4_ * 0.5;
    auVar106._12_4_ = auVar90._12_4_ * 0.5;
    auVar106._16_4_ = auVar90._16_4_ * 0.5;
    auVar106._20_4_ = auVar90._20_4_ * 0.5;
    auVar106._24_4_ = auVar90._24_4_ * 0.5;
    auVar106._28_4_ = auVar90._28_4_;
    fVar247 = auVar91._0_4_ * 0.5;
    fVar250 = auVar91._4_4_ * 0.5;
    auVar107._4_4_ = fVar250;
    auVar107._0_4_ = fVar247;
    fVar251 = auVar91._8_4_ * 0.5;
    auVar107._8_4_ = fVar251;
    fVar252 = auVar91._12_4_ * 0.5;
    auVar107._12_4_ = fVar252;
    fVar221 = auVar91._16_4_ * 0.5;
    auVar107._16_4_ = fVar221;
    fVar224 = auVar91._20_4_ * 0.5;
    auVar107._20_4_ = fVar224;
    fVar225 = auVar91._24_4_ * 0.5;
    auVar107._24_4_ = fVar225;
    auVar107._28_4_ = auVar91._28_4_;
    auVar90 = vmulps_avx512vl(auVar118,auVar107);
    auVar92 = vmulps_avx512vl(local_380,auVar107);
    auVar95 = vmulps_avx512vl(local_3a0,auVar107);
    auVar108._4_4_ = fVar250 * (float)local_580._4_4_;
    auVar108._0_4_ = fVar247 * (float)local_580._0_4_;
    auVar108._8_4_ = fVar251 * fStack_578;
    auVar108._12_4_ = fVar252 * fStack_574;
    auVar108._16_4_ = fVar221 * fStack_570;
    auVar108._20_4_ = fVar224 * fStack_56c;
    auVar108._24_4_ = fVar225 * fStack_568;
    auVar108._28_4_ = auVar91._28_4_;
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar106,auVar119);
    auVar91 = vfmadd231ps_avx512vl(auVar92,auVar106,local_300);
    auVar92 = vfmadd231ps_avx512vl(auVar95,auVar106,local_320);
    auVar95 = vfmadd231ps_avx512vl(auVar108,local_340,auVar106);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar101,auVar59);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar101,local_280);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar101,local_2a0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,local_2c0,auVar101);
    auVar80 = vfmadd231ps_fma(auVar90,auVar100,auVar60);
    auVar90 = vfmadd231ps_avx512vl(auVar91,auVar100,local_200);
    auVar91 = vfmadd231ps_avx512vl(auVar92,auVar100,local_220);
    auVar92 = vfmadd231ps_avx512vl(auVar95,local_240,auVar100);
    auVar115._4_4_ = auVar80._4_4_ * fVar236;
    auVar115._0_4_ = auVar80._0_4_ * fVar236;
    auVar115._8_4_ = auVar80._8_4_ * fVar236;
    auVar115._12_4_ = auVar80._12_4_ * fVar236;
    auVar115._16_4_ = fVar236 * 0.0;
    auVar115._20_4_ = fVar236 * 0.0;
    auVar115._24_4_ = fVar236 * 0.0;
    auVar115._28_4_ = auVar89._28_4_;
    auVar262 = ZEXT3264(auVar115);
    auVar116._4_4_ = auVar90._4_4_ * fVar236;
    auVar116._0_4_ = auVar90._0_4_ * fVar236;
    auVar116._8_4_ = auVar90._8_4_ * fVar236;
    auVar116._12_4_ = auVar90._12_4_ * fVar236;
    auVar116._16_4_ = auVar90._16_4_ * fVar236;
    auVar116._20_4_ = auVar90._20_4_ * fVar236;
    auVar116._24_4_ = auVar90._24_4_ * fVar236;
    auVar116._28_4_ = auVar90._28_4_;
    auVar117._4_4_ = auVar91._4_4_ * fVar236;
    auVar117._0_4_ = auVar91._0_4_ * fVar236;
    auVar117._8_4_ = auVar91._8_4_ * fVar236;
    auVar117._12_4_ = auVar91._12_4_ * fVar236;
    auVar117._16_4_ = auVar91._16_4_ * fVar236;
    auVar117._20_4_ = auVar91._20_4_ * fVar236;
    auVar117._24_4_ = auVar91._24_4_ * fVar236;
    auVar117._28_4_ = auVar91._28_4_;
    auVar269 = ZEXT3264(auVar117);
    fVar247 = auVar92._0_4_ * fVar236;
    fVar250 = auVar92._4_4_ * fVar236;
    auVar109._4_4_ = fVar250;
    auVar109._0_4_ = fVar247;
    fVar251 = auVar92._8_4_ * fVar236;
    auVar109._8_4_ = fVar251;
    fVar252 = auVar92._12_4_ * fVar236;
    auVar109._12_4_ = fVar252;
    fVar221 = auVar92._16_4_ * fVar236;
    auVar109._16_4_ = fVar221;
    fVar224 = auVar92._20_4_ * fVar236;
    auVar109._20_4_ = fVar224;
    fVar236 = auVar92._24_4_ * fVar236;
    auVar109._24_4_ = fVar236;
    auVar109._28_4_ = fStack_1c4;
    auVar80 = vxorps_avx512vl(auVar58,auVar58);
    auVar96 = vpermt2ps_avx512vl(ZEXT1632(auVar78),_DAT_0205fd20,ZEXT1632(auVar80));
    auVar97 = vpermt2ps_avx512vl(local_920,_DAT_0205fd20,ZEXT1632(auVar80));
    auVar91 = ZEXT1632(auVar80);
    auVar98 = vpermt2ps_avx512vl(auVar94,_DAT_0205fd20,auVar91);
    auVar218._0_4_ = auVar93._0_4_ + fVar247;
    auVar218._4_4_ = auVar93._4_4_ + fVar250;
    auVar218._8_4_ = auVar93._8_4_ + fVar251;
    auVar218._12_4_ = auVar93._12_4_ + fVar252;
    auVar218._16_4_ = auVar93._16_4_ + fVar221;
    auVar218._20_4_ = auVar93._20_4_ + fVar224;
    auVar218._24_4_ = auVar93._24_4_ + fVar236;
    auVar218._28_4_ = auVar93._28_4_ + fStack_1c4;
    auVar89 = vmaxps_avx(auVar93,auVar218);
    auVar90 = vminps_avx(auVar93,auVar218);
    auVar95 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,auVar91);
    auVar99 = vpermt2ps_avx512vl(auVar115,_DAT_0205fd20,auVar91);
    auVar100 = vpermt2ps_avx512vl(auVar116,_DAT_0205fd20,auVar91);
    auVar118 = ZEXT1632(auVar80);
    auVar101 = vpermt2ps_avx512vl(auVar117,_DAT_0205fd20,auVar118);
    auVar91 = vpermt2ps_avx512vl(auVar109,_DAT_0205fd20,auVar118);
    auVar102 = vsubps_avx512vl(auVar95,auVar91);
    auVar91 = vsubps_avx(auVar96,ZEXT1632(auVar78));
    auVar92 = vsubps_avx(auVar97,local_920);
    local_700 = vsubps_avx512vl(auVar98,auVar94);
    auVar93 = vmulps_avx512vl(auVar92,auVar117);
    auVar93 = vfmsub231ps_avx512vl(auVar93,auVar116,local_700);
    auVar103 = vmulps_avx512vl(local_700,auVar115);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar117,auVar91);
    auVar104 = vmulps_avx512vl(auVar91,auVar116);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar115,auVar92);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar93,auVar93);
    auVar93 = vmulps_avx512vl(local_700,local_700);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar92,auVar92);
    auVar104 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar91);
    auVar105 = vrcp14ps_avx512vl(auVar104);
    auVar93._8_4_ = 0x3f800000;
    auVar93._0_8_ = &DAT_3f8000003f800000;
    auVar93._12_4_ = 0x3f800000;
    auVar93._16_4_ = 0x3f800000;
    auVar93._20_4_ = 0x3f800000;
    auVar93._24_4_ = 0x3f800000;
    auVar93._28_4_ = 0x3f800000;
    auVar93 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar93);
    auVar93 = vfmadd132ps_avx512vl(auVar93,auVar105,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar93);
    auVar105 = vmulps_avx512vl(auVar92,auVar101);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar100,local_700);
    auVar106 = vmulps_avx512vl(local_700,auVar99);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar101,auVar91);
    auVar107 = vmulps_avx512vl(auVar91,auVar100);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar99,auVar92);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar93 = vmulps_avx512vl(auVar105,auVar93);
    auVar93 = vmaxps_avx512vl(auVar103,auVar93);
    auVar93 = vsqrtps_avx512vl(auVar93);
    auVar103 = vmaxps_avx512vl(auVar102,auVar95);
    auVar89 = vmaxps_avx512vl(auVar89,auVar103);
    auVar103 = vaddps_avx512vl(auVar93,auVar89);
    auVar89 = vminps_avx512vl(auVar102,auVar95);
    auVar89 = vminps_avx(auVar90,auVar89);
    auVar89 = vsubps_avx512vl(auVar89,auVar93);
    auVar95._8_4_ = 0x3f800002;
    auVar95._0_8_ = 0x3f8000023f800002;
    auVar95._12_4_ = 0x3f800002;
    auVar95._16_4_ = 0x3f800002;
    auVar95._20_4_ = 0x3f800002;
    auVar95._24_4_ = 0x3f800002;
    auVar95._28_4_ = 0x3f800002;
    auVar90 = vmulps_avx512vl(auVar103,auVar95);
    auVar102._8_4_ = 0x3f7ffffc;
    auVar102._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar102._12_4_ = 0x3f7ffffc;
    auVar102._16_4_ = 0x3f7ffffc;
    auVar102._20_4_ = 0x3f7ffffc;
    auVar102._24_4_ = 0x3f7ffffc;
    auVar102._28_4_ = 0x3f7ffffc;
    auVar93 = vmulps_avx512vl(auVar89,auVar102);
    auVar110._4_4_ = auVar90._4_4_ * auVar90._4_4_;
    auVar110._0_4_ = auVar90._0_4_ * auVar90._0_4_;
    auVar110._8_4_ = auVar90._8_4_ * auVar90._8_4_;
    auVar110._12_4_ = auVar90._12_4_ * auVar90._12_4_;
    auVar110._16_4_ = auVar90._16_4_ * auVar90._16_4_;
    auVar110._20_4_ = auVar90._20_4_ * auVar90._20_4_;
    auVar110._24_4_ = auVar90._24_4_ * auVar90._24_4_;
    auVar110._28_4_ = auVar93._28_4_;
    auVar89 = vrsqrt14ps_avx512vl(auVar104);
    auVar103._8_4_ = 0xbf000000;
    auVar103._0_8_ = 0xbf000000bf000000;
    auVar103._12_4_ = 0xbf000000;
    auVar103._16_4_ = 0xbf000000;
    auVar103._20_4_ = 0xbf000000;
    auVar103._24_4_ = 0xbf000000;
    auVar103._28_4_ = 0xbf000000;
    auVar90 = vmulps_avx512vl(auVar104,auVar103);
    auVar111._4_4_ = auVar89._4_4_ * auVar90._4_4_;
    auVar111._0_4_ = auVar89._0_4_ * auVar90._0_4_;
    auVar111._8_4_ = auVar89._8_4_ * auVar90._8_4_;
    auVar111._12_4_ = auVar89._12_4_ * auVar90._12_4_;
    auVar111._16_4_ = auVar89._16_4_ * auVar90._16_4_;
    auVar111._20_4_ = auVar89._20_4_ * auVar90._20_4_;
    auVar111._24_4_ = auVar89._24_4_ * auVar90._24_4_;
    auVar111._28_4_ = auVar90._28_4_;
    auVar90 = vmulps_avx512vl(auVar89,auVar89);
    auVar90 = vmulps_avx512vl(auVar90,auVar111);
    auVar104._8_4_ = 0x3fc00000;
    auVar104._0_8_ = 0x3fc000003fc00000;
    auVar104._12_4_ = 0x3fc00000;
    auVar104._16_4_ = 0x3fc00000;
    auVar104._20_4_ = 0x3fc00000;
    auVar104._24_4_ = 0x3fc00000;
    auVar104._28_4_ = 0x3fc00000;
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar104);
    auVar270 = ZEXT3264(auVar90);
    auVar112._4_4_ = auVar90._4_4_ * auVar91._4_4_;
    auVar112._0_4_ = auVar90._0_4_ * auVar91._0_4_;
    auVar112._8_4_ = auVar90._8_4_ * auVar91._8_4_;
    auVar112._12_4_ = auVar90._12_4_ * auVar91._12_4_;
    auVar112._16_4_ = auVar90._16_4_ * auVar91._16_4_;
    auVar112._20_4_ = auVar90._20_4_ * auVar91._20_4_;
    auVar112._24_4_ = auVar90._24_4_ * auVar91._24_4_;
    auVar112._28_4_ = auVar89._28_4_;
    auVar89 = vmulps_avx512vl(auVar92,auVar90);
    auVar95 = vmulps_avx512vl(local_700,auVar90);
    local_6e0 = ZEXT1632(auVar78);
    auVar102 = vsubps_avx512vl(auVar118,local_6e0);
    auVar103 = vsubps_avx512vl(auVar118,local_920);
    auVar104 = vsubps_avx512vl(auVar118,auVar94);
    auVar105 = vmulps_avx512vl(auVar274._0_32_,auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar88,auVar103);
    auVar105 = vfmadd231ps_avx512vl(auVar105,local_780,auVar102);
    auVar106 = vmulps_avx512vl(auVar104,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar103);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar102);
    auVar107 = vmulps_avx512vl(auVar274._0_32_,auVar95);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar89,auVar88);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar112,local_780);
    auVar95 = vmulps_avx512vl(auVar104,auVar95);
    auVar89 = vfmadd231ps_avx512vl(auVar95,auVar103,auVar89);
    auVar95 = vfmadd231ps_avx512vl(auVar89,auVar102,auVar112);
    local_720 = vmulps_avx512vl(auVar107,auVar107);
    auVar89 = vsubps_avx(local_3c0,local_720);
    auVar272 = ZEXT3264(auVar89);
    auVar108 = vmulps_avx512vl(auVar107,auVar95);
    auVar105 = vsubps_avx512vl(auVar105,auVar108);
    auVar108 = vaddps_avx512vl(auVar105,auVar105);
    auVar105 = vmulps_avx512vl(auVar95,auVar95);
    local_940 = vsubps_avx512vl(auVar106,auVar105);
    auVar106 = vsubps_avx512vl(local_940,auVar110);
    auVar109 = vmulps_avx512vl(auVar108,auVar108);
    auVar105._8_4_ = 0x40800000;
    auVar105._0_8_ = 0x4080000040800000;
    auVar105._12_4_ = 0x40800000;
    auVar105._16_4_ = 0x40800000;
    auVar105._20_4_ = 0x40800000;
    auVar105._24_4_ = 0x40800000;
    auVar105._28_4_ = 0x40800000;
    auVar105 = vmulps_avx512vl(auVar89,auVar105);
    auVar110 = vmulps_avx512vl(auVar105,auVar106);
    auVar110 = vsubps_avx512vl(auVar109,auVar110);
    uVar73 = vcmpps_avx512vl(auVar110,auVar118,5);
    bVar61 = (byte)uVar73;
    if (bVar61 == 0) {
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar110 = vsqrtps_avx512vl(auVar110);
      auVar111 = vaddps_avx512vl(auVar89,auVar89);
      auVar112 = vrcp14ps_avx512vl(auVar111);
      auVar27._8_4_ = 0x3f800000;
      auVar27._0_8_ = &DAT_3f8000003f800000;
      auVar27._12_4_ = 0x3f800000;
      auVar27._16_4_ = 0x3f800000;
      auVar27._20_4_ = 0x3f800000;
      auVar27._24_4_ = 0x3f800000;
      auVar27._28_4_ = 0x3f800000;
      auVar111 = vfnmadd213ps_avx512vl(auVar111,auVar112,auVar27);
      auVar111 = vfmadd132ps_avx512vl(auVar111,auVar112,auVar112);
      auVar28._8_4_ = 0x80000000;
      auVar28._0_8_ = 0x8000000080000000;
      auVar28._12_4_ = 0x80000000;
      auVar28._16_4_ = 0x80000000;
      auVar28._20_4_ = 0x80000000;
      auVar28._24_4_ = 0x80000000;
      auVar28._28_4_ = 0x80000000;
      auVar112 = vxorps_avx512vl(auVar108,auVar28);
      auVar112 = vsubps_avx512vl(auVar112,auVar110);
      auVar112 = vmulps_avx512vl(auVar112,auVar111);
      auVar110 = vsubps_avx512vl(auVar110,auVar108);
      auVar110 = vmulps_avx512vl(auVar110,auVar111);
      auVar111 = vfmadd213ps_avx512vl(auVar107,auVar112,auVar95);
      local_660 = vmulps_avx512vl(auVar90,auVar111);
      auVar111 = vfmadd213ps_avx512vl(auVar107,auVar110,auVar95);
      local_680 = vmulps_avx512vl(auVar90,auVar111);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar111 = vblendmps_avx512vl(auVar111,auVar112);
      auVar113._0_4_ =
           (uint)(bVar61 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar61 & 1) * local_680._0_4_;
      bVar11 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar11 * auVar111._4_4_ | (uint)!bVar11 * local_680._4_4_;
      bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar11 * auVar111._8_4_ | (uint)!bVar11 * local_680._8_4_;
      bVar11 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar11 * auVar111._12_4_ | (uint)!bVar11 * local_680._12_4_;
      bVar11 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar113._16_4_ = (uint)bVar11 * auVar111._16_4_ | (uint)!bVar11 * local_680._16_4_;
      bVar11 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar113._20_4_ = (uint)bVar11 * auVar111._20_4_ | (uint)!bVar11 * local_680._20_4_;
      bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar113._24_4_ = (uint)bVar11 * auVar111._24_4_ | (uint)!bVar11 * local_680._24_4_;
      bVar11 = SUB81(uVar73 >> 7,0);
      auVar113._28_4_ = (uint)bVar11 * auVar111._28_4_ | (uint)!bVar11 * local_680._28_4_;
      auVar205._8_4_ = 0xff800000;
      auVar205._0_8_ = 0xff800000ff800000;
      auVar205._12_4_ = 0xff800000;
      auVar205._16_4_ = 0xff800000;
      auVar205._20_4_ = 0xff800000;
      auVar205._24_4_ = 0xff800000;
      auVar205._28_4_ = 0xff800000;
      auVar111 = vblendmps_avx512vl(auVar205,auVar110);
      auVar114._0_4_ =
           (uint)(bVar61 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar110._0_4_;
      bVar11 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar11 * auVar111._4_4_ | (uint)!bVar11 * auVar110._4_4_;
      bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar11 * auVar111._8_4_ | (uint)!bVar11 * auVar110._8_4_;
      bVar11 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar11 * auVar111._12_4_ | (uint)!bVar11 * auVar110._12_4_;
      bVar11 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar114._16_4_ = (uint)bVar11 * auVar111._16_4_ | (uint)!bVar11 * auVar110._16_4_;
      bVar11 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar114._20_4_ = (uint)bVar11 * auVar111._20_4_ | (uint)!bVar11 * auVar110._20_4_;
      bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar114._24_4_ = (uint)bVar11 * auVar111._24_4_ | (uint)!bVar11 * auVar110._24_4_;
      bVar11 = SUB81(uVar73 >> 7,0);
      auVar114._28_4_ = (uint)bVar11 * auVar111._28_4_ | (uint)!bVar11 * auVar110._28_4_;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_720,auVar111);
      auVar110 = vmaxps_avx(local_5a0,auVar111);
      auVar29._8_4_ = 0x36000000;
      auVar29._0_8_ = 0x3600000036000000;
      auVar29._12_4_ = 0x36000000;
      auVar29._16_4_ = 0x36000000;
      auVar29._20_4_ = 0x36000000;
      auVar29._24_4_ = 0x36000000;
      auVar29._28_4_ = 0x36000000;
      auVar110 = vmulps_avx512vl(auVar110,auVar29);
      vandps_avx512vl(auVar89,auVar111);
      uVar64 = vcmpps_avx512vl(auVar110,auVar110,1);
      uVar73 = uVar73 & uVar64;
      bVar68 = (byte)uVar73;
      if (bVar68 != 0) {
        uVar64 = vcmpps_avx512vl(auVar106,_DAT_02020f00,2);
        auVar220._8_4_ = 0xff800000;
        auVar220._0_8_ = 0xff800000ff800000;
        auVar220._12_4_ = 0xff800000;
        auVar220._16_4_ = 0xff800000;
        auVar220._20_4_ = 0xff800000;
        auVar220._24_4_ = 0xff800000;
        auVar220._28_4_ = 0xff800000;
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar111 = vblendmps_avx512vl(auVar106,auVar220);
        bVar65 = (byte)uVar64;
        uVar66 = (uint)(bVar65 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar110._0_4_;
        bVar11 = (bool)((byte)(uVar64 >> 1) & 1);
        uVar133 = (uint)bVar11 * auVar111._4_4_ | (uint)!bVar11 * auVar110._4_4_;
        bVar11 = (bool)((byte)(uVar64 >> 2) & 1);
        uVar134 = (uint)bVar11 * auVar111._8_4_ | (uint)!bVar11 * auVar110._8_4_;
        bVar11 = (bool)((byte)(uVar64 >> 3) & 1);
        uVar135 = (uint)bVar11 * auVar111._12_4_ | (uint)!bVar11 * auVar110._12_4_;
        bVar11 = (bool)((byte)(uVar64 >> 4) & 1);
        uVar136 = (uint)bVar11 * auVar111._16_4_ | (uint)!bVar11 * auVar110._16_4_;
        bVar11 = (bool)((byte)(uVar64 >> 5) & 1);
        uVar137 = (uint)bVar11 * auVar111._20_4_ | (uint)!bVar11 * auVar110._20_4_;
        bVar11 = (bool)((byte)(uVar64 >> 6) & 1);
        uVar138 = (uint)bVar11 * auVar111._24_4_ | (uint)!bVar11 * auVar110._24_4_;
        bVar11 = SUB81(uVar64 >> 7,0);
        uVar139 = (uint)bVar11 * auVar111._28_4_ | (uint)!bVar11 * auVar110._28_4_;
        auVar113._0_4_ = (bVar68 & 1) * uVar66 | !(bool)(bVar68 & 1) * auVar113._0_4_;
        bVar11 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar113._4_4_ = bVar11 * uVar133 | !bVar11 * auVar113._4_4_;
        bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar113._8_4_ = bVar11 * uVar134 | !bVar11 * auVar113._8_4_;
        bVar11 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar113._12_4_ = bVar11 * uVar135 | !bVar11 * auVar113._12_4_;
        bVar11 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar113._16_4_ = bVar11 * uVar136 | !bVar11 * auVar113._16_4_;
        bVar11 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar113._20_4_ = bVar11 * uVar137 | !bVar11 * auVar113._20_4_;
        bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar113._24_4_ = bVar11 * uVar138 | !bVar11 * auVar113._24_4_;
        bVar11 = SUB81(uVar73 >> 7,0);
        auVar113._28_4_ = bVar11 * uVar139 | !bVar11 * auVar113._28_4_;
        auVar106 = vblendmps_avx512vl(auVar220,auVar106);
        bVar11 = (bool)((byte)(uVar64 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar64 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar64 >> 6) & 1);
        bVar17 = SUB81(uVar64 >> 7,0);
        auVar114._0_4_ =
             (uint)(bVar68 & 1) *
             ((uint)(bVar65 & 1) * auVar106._0_4_ | !(bool)(bVar65 & 1) * uVar66) |
             !(bool)(bVar68 & 1) * auVar114._0_4_;
        bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar114._4_4_ =
             (uint)bVar72 * ((uint)bVar11 * auVar106._4_4_ | !bVar11 * uVar133) |
             !bVar72 * auVar114._4_4_;
        bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar114._8_4_ =
             (uint)bVar11 * ((uint)bVar12 * auVar106._8_4_ | !bVar12 * uVar134) |
             !bVar11 * auVar114._8_4_;
        bVar11 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar114._12_4_ =
             (uint)bVar11 * ((uint)bVar13 * auVar106._12_4_ | !bVar13 * uVar135) |
             !bVar11 * auVar114._12_4_;
        bVar11 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar114._16_4_ =
             (uint)bVar11 * ((uint)bVar15 * auVar106._16_4_ | !bVar15 * uVar136) |
             !bVar11 * auVar114._16_4_;
        bVar11 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar114._20_4_ =
             (uint)bVar11 * ((uint)bVar14 * auVar106._20_4_ | !bVar14 * uVar137) |
             !bVar11 * auVar114._20_4_;
        bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar114._24_4_ =
             (uint)bVar11 * ((uint)bVar16 * auVar106._24_4_ | !bVar16 * uVar138) |
             !bVar11 * auVar114._24_4_;
        bVar11 = SUB81(uVar73 >> 7,0);
        auVar114._28_4_ =
             (uint)bVar11 * ((uint)bVar17 * auVar106._28_4_ | !bVar17 * uVar139) |
             !bVar11 * auVar114._28_4_;
        bVar61 = (~bVar68 | bVar65) & bVar61;
      }
    }
    if ((bVar61 & 0x7f) == 0) {
      auVar249 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar255 = ZEXT3264(_DAT_02020f20);
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar275 = ZEXT3264(auVar89);
      auVar274 = ZEXT3264(local_8c0);
    }
    else {
      fVar247 = *(float *)(ray + k * 4 + 0x100) - (float)local_7c0._0_4_;
      auVar206._4_4_ = fVar247;
      auVar206._0_4_ = fVar247;
      auVar206._8_4_ = fVar247;
      auVar206._12_4_ = fVar247;
      auVar206._16_4_ = fVar247;
      auVar206._20_4_ = fVar247;
      auVar206._24_4_ = fVar247;
      auVar206._28_4_ = fVar247;
      auVar106 = vminps_avx512vl(auVar206,auVar114);
      auVar57._4_4_ = fStack_3dc;
      auVar57._0_4_ = local_3e0;
      auVar57._8_4_ = fStack_3d8;
      auVar57._12_4_ = fStack_3d4;
      auVar57._16_4_ = fStack_3d0;
      auVar57._20_4_ = fStack_3cc;
      auVar57._24_4_ = fStack_3c8;
      auVar57._28_4_ = fStack_3c4;
      auVar110 = vmaxps_avx512vl(auVar57,auVar113);
      auVar104 = vmulps_avx512vl(auVar104,auVar117);
      auVar103 = vfmadd213ps_avx512vl(auVar103,auVar116,auVar104);
      auVar102 = vfmadd213ps_avx512vl(auVar102,auVar115,auVar103);
      auVar274 = ZEXT3264(local_8c0);
      auVar103 = vmulps_avx512vl(local_8c0,auVar117);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar88,auVar116);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_780,auVar115);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar103,auVar115);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar18 = vcmpps_avx512vl(auVar115,auVar116,1);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar102 = vxorps_avx512vl(auVar102,auVar117);
      auVar104 = vrcp14ps_avx512vl(auVar103);
      auVar111 = vxorps_avx512vl(auVar103,auVar117);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar275 = ZEXT3264(auVar112);
      auVar118 = vfnmadd213ps_avx512vl(auVar104,auVar103,auVar112);
      auVar118 = vfmadd132ps_avx512vl(auVar118,auVar104,auVar104);
      auVar118 = vmulps_avx512vl(auVar118,auVar102);
      uVar19 = vcmpps_avx512vl(auVar103,auVar111,1);
      bVar68 = (byte)uVar18 | (byte)uVar19;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar102 = vblendmps_avx512vl(auVar118,auVar119);
      auVar120._0_4_ =
           (uint)(bVar68 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar104._0_4_;
      bVar11 = (bool)(bVar68 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * auVar104._4_4_;
      bVar11 = (bool)(bVar68 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * auVar104._8_4_;
      bVar11 = (bool)(bVar68 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * auVar104._12_4_;
      bVar11 = (bool)(bVar68 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar11 * auVar102._16_4_ | (uint)!bVar11 * auVar104._16_4_;
      bVar11 = (bool)(bVar68 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar11 * auVar102._20_4_ | (uint)!bVar11 * auVar104._20_4_;
      bVar11 = (bool)(bVar68 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar11 * auVar102._24_4_ | (uint)!bVar11 * auVar104._24_4_;
      auVar120._28_4_ =
           (uint)(bVar68 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar104._28_4_;
      auVar102 = vmaxps_avx(auVar110,auVar120);
      uVar19 = vcmpps_avx512vl(auVar103,auVar111,6);
      bVar68 = (byte)uVar18 | (byte)uVar19;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar121._0_4_ =
           (uint)(bVar68 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar118._0_4_;
      bVar11 = (bool)(bVar68 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar11 * auVar110._4_4_ | (uint)!bVar11 * auVar118._4_4_;
      bVar11 = (bool)(bVar68 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar11 * auVar110._8_4_ | (uint)!bVar11 * auVar118._8_4_;
      bVar11 = (bool)(bVar68 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar11 * auVar110._12_4_ | (uint)!bVar11 * auVar118._12_4_;
      bVar11 = (bool)(bVar68 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar11 * auVar110._16_4_ | (uint)!bVar11 * auVar118._16_4_;
      bVar11 = (bool)(bVar68 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar11 * auVar110._20_4_ | (uint)!bVar11 * auVar118._20_4_;
      bVar11 = (bool)(bVar68 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar11 * auVar110._24_4_ | (uint)!bVar11 * auVar118._24_4_;
      auVar121._28_4_ =
           (uint)(bVar68 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar118._28_4_;
      auVar103 = vminps_avx(auVar106,auVar121);
      auVar269 = ZEXT864(0) << 0x20;
      auVar104 = vsubps_avx(ZEXT832(0) << 0x20,auVar96);
      auVar96 = vsubps_avx(ZEXT832(0) << 0x20,auVar97);
      auVar106 = ZEXT832(0) << 0x20;
      auVar97 = vsubps_avx(auVar106,auVar98);
      auVar38._4_4_ = auVar97._4_4_ * auVar101._4_4_;
      auVar38._0_4_ = auVar97._0_4_ * auVar101._0_4_;
      auVar38._8_4_ = auVar97._8_4_ * auVar101._8_4_;
      auVar38._12_4_ = auVar97._12_4_ * auVar101._12_4_;
      auVar38._16_4_ = auVar97._16_4_ * auVar101._16_4_;
      auVar38._20_4_ = auVar97._20_4_ * auVar101._20_4_;
      auVar38._24_4_ = auVar97._24_4_ * auVar101._24_4_;
      auVar38._28_4_ = auVar97._28_4_;
      auVar96 = vfnmsub231ps_avx512vl(auVar38,auVar100,auVar96);
      auVar104 = vfnmadd231ps_avx512vl(auVar96,auVar99,auVar104);
      auVar96 = vmulps_avx512vl(local_8c0,auVar101);
      auVar96 = vfnmsub231ps_avx512vl(auVar96,auVar88,auVar100);
      auVar96 = vfnmadd231ps_avx512vl(auVar96,local_780,auVar99);
      vandps_avx512vl(auVar96,auVar115);
      uVar18 = vcmpps_avx512vl(auVar96,auVar116,1);
      auVar104 = vxorps_avx512vl(auVar104,auVar117);
      auVar97 = vrcp14ps_avx512vl(auVar96);
      auVar98 = vxorps_avx512vl(auVar96,auVar117);
      auVar262 = ZEXT3264(auVar98);
      auVar99 = vfnmadd213ps_avx512vl(auVar97,auVar96,auVar112);
      auVar80 = vfmadd132ps_fma(auVar99,auVar97,auVar97);
      fVar247 = auVar80._0_4_ * auVar104._0_4_;
      fVar250 = auVar80._4_4_ * auVar104._4_4_;
      auVar39._4_4_ = fVar250;
      auVar39._0_4_ = fVar247;
      fVar251 = auVar80._8_4_ * auVar104._8_4_;
      auVar39._8_4_ = fVar251;
      fVar252 = auVar80._12_4_ * auVar104._12_4_;
      auVar39._12_4_ = fVar252;
      fVar236 = auVar104._16_4_ * 0.0;
      auVar39._16_4_ = fVar236;
      fVar221 = auVar104._20_4_ * 0.0;
      auVar39._20_4_ = fVar221;
      fVar224 = auVar104._24_4_ * 0.0;
      auVar39._24_4_ = fVar224;
      auVar39._28_4_ = auVar104._28_4_;
      uVar19 = vcmpps_avx512vl(auVar96,auVar98,1);
      bVar68 = (byte)uVar18 | (byte)uVar19;
      auVar99 = vblendmps_avx512vl(auVar39,auVar119);
      auVar122._0_4_ =
           (uint)(bVar68 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar97._0_4_;
      bVar11 = (bool)(bVar68 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * auVar97._4_4_;
      bVar11 = (bool)(bVar68 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * auVar97._8_4_;
      bVar11 = (bool)(bVar68 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * auVar97._12_4_;
      bVar11 = (bool)(bVar68 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar11 * auVar99._16_4_ | (uint)!bVar11 * auVar97._16_4_;
      bVar11 = (bool)(bVar68 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar11 * auVar99._20_4_ | (uint)!bVar11 * auVar97._20_4_;
      bVar11 = (bool)(bVar68 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar11 * auVar99._24_4_ | (uint)!bVar11 * auVar97._24_4_;
      auVar122._28_4_ =
           (uint)(bVar68 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar97._28_4_;
      _local_760 = vmaxps_avx(auVar102,auVar122);
      uVar19 = vcmpps_avx512vl(auVar96,auVar98,6);
      bVar68 = (byte)uVar18 | (byte)uVar19;
      auVar123._0_4_ =
           (uint)(bVar68 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar68 & 1) * (int)fVar247;
      bVar11 = (bool)(bVar68 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar11 * auVar110._4_4_ | (uint)!bVar11 * (int)fVar250;
      bVar11 = (bool)(bVar68 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar11 * auVar110._8_4_ | (uint)!bVar11 * (int)fVar251;
      bVar11 = (bool)(bVar68 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar11 * auVar110._12_4_ | (uint)!bVar11 * (int)fVar252;
      bVar11 = (bool)(bVar68 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar11 * auVar110._16_4_ | (uint)!bVar11 * (int)fVar236;
      bVar11 = (bool)(bVar68 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar11 * auVar110._20_4_ | (uint)!bVar11 * (int)fVar221;
      bVar11 = (bool)(bVar68 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar11 * auVar110._24_4_ | (uint)!bVar11 * (int)fVar224;
      auVar123._28_4_ =
           (uint)(bVar68 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar68 >> 7) * auVar104._28_4_;
      local_420 = vminps_avx(auVar103,auVar123);
      uVar18 = vcmpps_avx512vl(_local_760,local_420,2);
      bVar61 = bVar61 & 0x7f & (byte)uVar18;
      if (bVar61 == 0) {
        auVar249 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar255 = ZEXT3264(_DAT_02020f20);
      }
      else {
        auVar93 = vmaxps_avx(auVar106,auVar93);
        auVar102 = vminps_avx512vl(local_660,auVar112);
        auVar44 = ZEXT412(0);
        auVar103 = ZEXT1232(auVar44) << 0x20;
        auVar102 = vmaxps_avx(auVar102,ZEXT1232(auVar44) << 0x20);
        auVar104 = vminps_avx512vl(local_680,auVar112);
        auVar40._4_4_ = (auVar102._4_4_ + 1.0) * 0.125;
        auVar40._0_4_ = (auVar102._0_4_ + 0.0) * 0.125;
        auVar40._8_4_ = (auVar102._8_4_ + 2.0) * 0.125;
        auVar40._12_4_ = (auVar102._12_4_ + 3.0) * 0.125;
        auVar40._16_4_ = (auVar102._16_4_ + 4.0) * 0.125;
        auVar40._20_4_ = (auVar102._20_4_ + 5.0) * 0.125;
        auVar40._24_4_ = (auVar102._24_4_ + 6.0) * 0.125;
        auVar40._28_4_ = auVar102._28_4_ + 7.0;
        auVar80 = vfmadd213ps_fma(auVar40,auVar150,auVar217);
        local_660 = ZEXT1632(auVar80);
        auVar102 = vmaxps_avx(auVar104,ZEXT1232(auVar44) << 0x20);
        auVar41._4_4_ = (auVar102._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar102._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar102._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar102._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar102._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar102._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar102._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar102._28_4_ + 7.0;
        auVar80 = vfmadd213ps_fma(auVar41,auVar150,auVar217);
        local_680 = ZEXT1632(auVar80);
        auVar207._0_4_ = auVar93._0_4_ * auVar93._0_4_;
        auVar207._4_4_ = auVar93._4_4_ * auVar93._4_4_;
        auVar207._8_4_ = auVar93._8_4_ * auVar93._8_4_;
        auVar207._12_4_ = auVar93._12_4_ * auVar93._12_4_;
        auVar207._16_4_ = auVar93._16_4_ * auVar93._16_4_;
        auVar207._20_4_ = auVar93._20_4_ * auVar93._20_4_;
        auVar207._24_4_ = auVar93._24_4_ * auVar93._24_4_;
        auVar207._28_4_ = 0;
        auVar93 = vsubps_avx(local_940,auVar207);
        auVar102 = vmulps_avx512vl(auVar105,auVar93);
        auVar102 = vsubps_avx512vl(auVar109,auVar102);
        uVar18 = vcmpps_avx512vl(auVar102,ZEXT1232(auVar44) << 0x20,5);
        bVar68 = (byte)uVar18;
        if (bVar68 == 0) {
          auVar90 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar91 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar105 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar124._8_4_ = 0x7f800000;
          auVar124._0_8_ = 0x7f8000007f800000;
          auVar124._12_4_ = 0x7f800000;
          auVar124._16_4_ = 0x7f800000;
          auVar124._20_4_ = 0x7f800000;
          auVar124._24_4_ = 0x7f800000;
          auVar124._28_4_ = 0x7f800000;
          auVar125._8_4_ = 0xff800000;
          auVar125._0_8_ = 0xff800000ff800000;
          auVar125._12_4_ = 0xff800000;
          auVar125._16_4_ = 0xff800000;
          auVar125._20_4_ = 0xff800000;
          auVar125._24_4_ = 0xff800000;
          auVar125._28_4_ = 0xff800000;
        }
        else {
          auVar79 = vxorps_avx512vl(auVar105._0_16_,auVar105._0_16_);
          uVar73 = vcmpps_avx512vl(auVar102,auVar106,5);
          auVar102 = vsqrtps_avx(auVar102);
          auVar219._0_4_ = auVar89._0_4_ + auVar89._0_4_;
          auVar219._4_4_ = auVar89._4_4_ + auVar89._4_4_;
          auVar219._8_4_ = auVar89._8_4_ + auVar89._8_4_;
          auVar219._12_4_ = auVar89._12_4_ + auVar89._12_4_;
          auVar219._16_4_ = auVar89._16_4_ + auVar89._16_4_;
          auVar219._20_4_ = auVar89._20_4_ + auVar89._20_4_;
          auVar219._24_4_ = auVar89._24_4_ + auVar89._24_4_;
          auVar219._28_4_ = auVar89._28_4_ + auVar89._28_4_;
          auVar103 = vrcp14ps_avx512vl(auVar219);
          auVar104 = vfnmadd213ps_avx512vl(auVar219,auVar103,auVar112);
          auVar80 = vfmadd132ps_fma(auVar104,auVar103,auVar103);
          auVar30._8_4_ = 0x80000000;
          auVar30._0_8_ = 0x8000000080000000;
          auVar30._12_4_ = 0x80000000;
          auVar30._16_4_ = 0x80000000;
          auVar30._20_4_ = 0x80000000;
          auVar30._24_4_ = 0x80000000;
          auVar30._28_4_ = 0x80000000;
          auVar103 = vxorps_avx512vl(auVar108,auVar30);
          auVar103 = vsubps_avx(auVar103,auVar102);
          auVar42._4_4_ = auVar103._4_4_ * auVar80._4_4_;
          auVar42._0_4_ = auVar103._0_4_ * auVar80._0_4_;
          auVar42._8_4_ = auVar103._8_4_ * auVar80._8_4_;
          auVar42._12_4_ = auVar103._12_4_ * auVar80._12_4_;
          auVar42._16_4_ = auVar103._16_4_ * 0.0;
          auVar42._20_4_ = auVar103._20_4_ * 0.0;
          auVar42._24_4_ = auVar103._24_4_ * 0.0;
          auVar42._28_4_ = 0x3e000000;
          auVar102 = vsubps_avx512vl(auVar102,auVar108);
          auVar268._0_4_ = auVar102._0_4_ * auVar80._0_4_;
          auVar268._4_4_ = auVar102._4_4_ * auVar80._4_4_;
          auVar268._8_4_ = auVar102._8_4_ * auVar80._8_4_;
          auVar268._12_4_ = auVar102._12_4_ * auVar80._12_4_;
          auVar268._16_4_ = auVar102._16_4_ * 0.0;
          auVar268._20_4_ = auVar102._20_4_ * 0.0;
          auVar268._24_4_ = auVar102._24_4_ * 0.0;
          auVar268._28_4_ = 0;
          auVar269 = ZEXT3264(auVar268);
          auVar102 = vfmadd213ps_avx512vl(auVar107,auVar42,auVar95);
          auVar43._4_4_ = auVar90._4_4_ * auVar102._4_4_;
          auVar43._0_4_ = auVar90._0_4_ * auVar102._0_4_;
          auVar43._8_4_ = auVar90._8_4_ * auVar102._8_4_;
          auVar43._12_4_ = auVar90._12_4_ * auVar102._12_4_;
          auVar43._16_4_ = auVar90._16_4_ * auVar102._16_4_;
          auVar43._20_4_ = auVar90._20_4_ * auVar102._20_4_;
          auVar43._24_4_ = auVar90._24_4_ * auVar102._24_4_;
          auVar43._28_4_ = auVar103._28_4_;
          auVar102 = vmulps_avx512vl(local_780,auVar42);
          auVar103 = vmulps_avx512vl(auVar88,auVar42);
          auVar96 = vmulps_avx512vl(local_8c0,auVar42);
          auVar104 = vfmadd213ps_avx512vl(auVar91,auVar43,local_6e0);
          auVar104 = vsubps_avx512vl(auVar102,auVar104);
          auVar102 = vfmadd213ps_avx512vl(auVar92,auVar43,local_920);
          auVar105 = vsubps_avx512vl(auVar103,auVar102);
          auVar80 = vfmadd213ps_fma(auVar43,local_700,auVar94);
          auVar102 = vsubps_avx(auVar96,ZEXT1632(auVar80));
          auVar95 = vfmadd213ps_avx512vl(auVar107,auVar268,auVar95);
          auVar95 = vmulps_avx512vl(auVar90,auVar95);
          auVar270 = ZEXT3264(auVar95);
          auVar90 = vmulps_avx512vl(local_780,auVar268);
          auVar96 = vmulps_avx512vl(auVar88,auVar268);
          auVar97 = vmulps_avx512vl(local_8c0,auVar268);
          auVar80 = vfmadd213ps_fma(auVar91,auVar95,local_6e0);
          auVar103 = vsubps_avx(auVar90,ZEXT1632(auVar80));
          auVar80 = vfmadd213ps_fma(auVar92,auVar95,local_920);
          auVar90 = vsubps_avx512vl(auVar96,ZEXT1632(auVar80));
          auVar80 = vfmadd213ps_fma(local_700,auVar95,auVar94);
          auVar91 = vsubps_avx512vl(auVar97,ZEXT1632(auVar80));
          auVar151._8_4_ = 0x7f800000;
          auVar151._0_8_ = 0x7f8000007f800000;
          auVar151._12_4_ = 0x7f800000;
          auVar151._16_4_ = 0x7f800000;
          auVar151._20_4_ = 0x7f800000;
          auVar151._24_4_ = 0x7f800000;
          auVar151._28_4_ = 0x7f800000;
          auVar92 = vblendmps_avx512vl(auVar151,auVar42);
          bVar11 = (bool)((byte)uVar73 & 1);
          auVar124._0_4_ = (uint)bVar11 * auVar92._0_4_ | (uint)!bVar11 * auVar78._0_4_;
          bVar11 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar11 * auVar92._4_4_ | (uint)!bVar11 * auVar78._4_4_;
          bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar11 * auVar92._8_4_ | (uint)!bVar11 * auVar78._8_4_;
          bVar11 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar11 * auVar92._12_4_ | (uint)!bVar11 * auVar78._12_4_;
          iVar1 = (uint)((byte)(uVar73 >> 4) & 1) * auVar92._16_4_;
          auVar124._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar73 >> 5) & 1) * auVar92._20_4_;
          auVar124._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar73 >> 6) & 1) * auVar92._24_4_;
          auVar124._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar73 >> 7) * auVar92._28_4_;
          auVar124._28_4_ = iVar4;
          auVar152._8_4_ = 0xff800000;
          auVar152._0_8_ = 0xff800000ff800000;
          auVar152._12_4_ = 0xff800000;
          auVar152._16_4_ = 0xff800000;
          auVar152._20_4_ = 0xff800000;
          auVar152._24_4_ = 0xff800000;
          auVar152._28_4_ = 0xff800000;
          auVar92 = vblendmps_avx512vl(auVar152,auVar268);
          bVar11 = (bool)((byte)uVar73 & 1);
          auVar125._0_4_ = (uint)bVar11 * auVar92._0_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar11 * auVar92._4_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar11 * auVar92._8_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar11 * auVar92._12_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar125._16_4_ = (uint)bVar11 * auVar92._16_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar125._20_4_ = (uint)bVar11 * auVar92._20_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar125._24_4_ = (uint)bVar11 * auVar92._24_4_ | (uint)!bVar11 * -0x800000;
          bVar11 = SUB81(uVar73 >> 7,0);
          auVar125._28_4_ = (uint)bVar11 * auVar92._28_4_ | (uint)!bVar11 * -0x800000;
          auVar239._8_4_ = 0x7fffffff;
          auVar239._0_8_ = 0x7fffffff7fffffff;
          auVar239._12_4_ = 0x7fffffff;
          auVar239._16_4_ = 0x7fffffff;
          auVar239._20_4_ = 0x7fffffff;
          auVar239._24_4_ = 0x7fffffff;
          auVar239._28_4_ = 0x7fffffff;
          auVar92 = vandps_avx(auVar239,local_720);
          auVar92 = vmaxps_avx(local_5a0,auVar92);
          auVar31._8_4_ = 0x36000000;
          auVar31._0_8_ = 0x3600000036000000;
          auVar31._12_4_ = 0x36000000;
          auVar31._16_4_ = 0x36000000;
          auVar31._20_4_ = 0x36000000;
          auVar31._24_4_ = 0x36000000;
          auVar31._28_4_ = 0x36000000;
          auVar92 = vmulps_avx512vl(auVar92,auVar31);
          auVar89 = vandps_avx(auVar89,auVar239);
          uVar64 = vcmpps_avx512vl(auVar89,auVar92,1);
          uVar73 = uVar73 & uVar64;
          bVar65 = (byte)uVar73;
          if (bVar65 != 0) {
            uVar64 = vcmpps_avx512vl(auVar93,ZEXT1632(auVar79),2);
            auVar240._8_4_ = 0xff800000;
            auVar240._0_8_ = 0xff800000ff800000;
            auVar240._12_4_ = 0xff800000;
            auVar240._16_4_ = 0xff800000;
            auVar240._20_4_ = 0xff800000;
            auVar240._24_4_ = 0xff800000;
            auVar240._28_4_ = 0xff800000;
            auVar261._8_4_ = 0x7f800000;
            auVar261._0_8_ = 0x7f8000007f800000;
            auVar261._12_4_ = 0x7f800000;
            auVar261._16_4_ = 0x7f800000;
            auVar261._20_4_ = 0x7f800000;
            auVar261._24_4_ = 0x7f800000;
            auVar261._28_4_ = 0x7f800000;
            auVar89 = vblendmps_avx512vl(auVar261,auVar240);
            bVar67 = (byte)uVar64;
            uVar66 = (uint)(bVar67 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar92._0_4_;
            bVar11 = (bool)((byte)(uVar64 >> 1) & 1);
            uVar133 = (uint)bVar11 * auVar89._4_4_ | (uint)!bVar11 * auVar92._4_4_;
            bVar11 = (bool)((byte)(uVar64 >> 2) & 1);
            uVar134 = (uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * auVar92._8_4_;
            bVar11 = (bool)((byte)(uVar64 >> 3) & 1);
            uVar135 = (uint)bVar11 * auVar89._12_4_ | (uint)!bVar11 * auVar92._12_4_;
            bVar11 = (bool)((byte)(uVar64 >> 4) & 1);
            uVar136 = (uint)bVar11 * auVar89._16_4_ | (uint)!bVar11 * auVar92._16_4_;
            bVar11 = (bool)((byte)(uVar64 >> 5) & 1);
            uVar137 = (uint)bVar11 * auVar89._20_4_ | (uint)!bVar11 * auVar92._20_4_;
            bVar11 = (bool)((byte)(uVar64 >> 6) & 1);
            uVar138 = (uint)bVar11 * auVar89._24_4_ | (uint)!bVar11 * auVar92._24_4_;
            bVar11 = SUB81(uVar64 >> 7,0);
            uVar139 = (uint)bVar11 * auVar89._28_4_ | (uint)!bVar11 * auVar92._28_4_;
            auVar124._0_4_ = (bVar65 & 1) * uVar66 | !(bool)(bVar65 & 1) * auVar124._0_4_;
            bVar11 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar124._4_4_ = bVar11 * uVar133 | !bVar11 * auVar124._4_4_;
            bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar124._8_4_ = bVar11 * uVar134 | !bVar11 * auVar124._8_4_;
            bVar11 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar124._12_4_ = bVar11 * uVar135 | !bVar11 * auVar124._12_4_;
            bVar11 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar124._16_4_ = bVar11 * uVar136 | (uint)!bVar11 * iVar1;
            bVar11 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar124._20_4_ = bVar11 * uVar137 | (uint)!bVar11 * iVar2;
            bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar124._24_4_ = bVar11 * uVar138 | (uint)!bVar11 * iVar3;
            bVar11 = SUB81(uVar73 >> 7,0);
            auVar124._28_4_ = bVar11 * uVar139 | (uint)!bVar11 * iVar4;
            auVar89 = vblendmps_avx512vl(auVar240,auVar261);
            bVar11 = (bool)((byte)(uVar64 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
            bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar64 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar64 >> 6) & 1);
            bVar17 = SUB81(uVar64 >> 7,0);
            auVar125._0_4_ =
                 (uint)(bVar65 & 1) *
                 ((uint)(bVar67 & 1) * auVar89._0_4_ | !(bool)(bVar67 & 1) * uVar66) |
                 !(bool)(bVar65 & 1) * auVar125._0_4_;
            bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar125._4_4_ =
                 (uint)bVar72 * ((uint)bVar11 * auVar89._4_4_ | !bVar11 * uVar133) |
                 !bVar72 * auVar125._4_4_;
            bVar11 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar125._8_4_ =
                 (uint)bVar11 * ((uint)bVar12 * auVar89._8_4_ | !bVar12 * uVar134) |
                 !bVar11 * auVar125._8_4_;
            bVar11 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar125._12_4_ =
                 (uint)bVar11 * ((uint)bVar13 * auVar89._12_4_ | !bVar13 * uVar135) |
                 !bVar11 * auVar125._12_4_;
            bVar11 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar125._16_4_ =
                 (uint)bVar11 * ((uint)bVar15 * auVar89._16_4_ | !bVar15 * uVar136) |
                 !bVar11 * auVar125._16_4_;
            bVar11 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar125._20_4_ =
                 (uint)bVar11 * ((uint)bVar14 * auVar89._20_4_ | !bVar14 * uVar137) |
                 !bVar11 * auVar125._20_4_;
            bVar11 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar125._24_4_ =
                 (uint)bVar11 * ((uint)bVar16 * auVar89._24_4_ | !bVar16 * uVar138) |
                 !bVar11 * auVar125._24_4_;
            bVar11 = SUB81(uVar73 >> 7,0);
            auVar125._28_4_ =
                 (uint)bVar11 * ((uint)bVar17 * auVar89._28_4_ | !bVar17 * uVar139) |
                 !bVar11 * auVar125._28_4_;
            bVar68 = (~bVar65 | bVar67) & bVar68;
          }
        }
        auVar259._8_4_ = 0x7fffffff;
        auVar259._0_8_ = 0x7fffffff7fffffff;
        auVar259._12_4_ = 0x7fffffff;
        auVar262 = ZEXT1664(auVar259);
        auVar89 = vmulps_avx512vl(local_8c0,auVar91);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar88,auVar90);
        auVar78 = vfmadd231ps_fma(auVar89,local_780,auVar103);
        _local_1c0 = _local_760;
        local_1a0 = vminps_avx(local_420,auVar124);
        auVar235._8_4_ = 0x7fffffff;
        auVar235._0_8_ = 0x7fffffff7fffffff;
        auVar235._12_4_ = 0x7fffffff;
        auVar235._16_4_ = 0x7fffffff;
        auVar235._20_4_ = 0x7fffffff;
        auVar235._24_4_ = 0x7fffffff;
        auVar235._28_4_ = 0x7fffffff;
        auVar89 = vandps_avx(ZEXT1632(auVar78),auVar235);
        _local_6c0 = vmaxps_avx(_local_760,auVar125);
        _local_440 = _local_6c0;
        auVar153._8_4_ = 0x3e99999a;
        auVar153._0_8_ = 0x3e99999a3e99999a;
        auVar153._12_4_ = 0x3e99999a;
        auVar153._16_4_ = 0x3e99999a;
        auVar153._20_4_ = 0x3e99999a;
        auVar153._24_4_ = 0x3e99999a;
        auVar153._28_4_ = 0x3e99999a;
        uVar18 = vcmpps_avx512vl(auVar89,auVar153,1);
        uVar19 = vcmpps_avx512vl(_local_760,local_1a0,2);
        bVar65 = (byte)uVar19 & bVar61;
        uVar20 = vcmpps_avx512vl(_local_6c0,local_420,2);
        if ((bVar61 & ((byte)uVar20 | (byte)uVar19)) == 0) {
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        }
        else {
          auVar89 = vmulps_avx512vl(local_8c0,auVar102);
          auVar89 = vfmadd213ps_avx512vl(auVar105,auVar88,auVar89);
          auVar78 = vfmadd213ps_fma(auVar104,local_780,auVar89);
          auVar89 = vandps_avx(ZEXT1632(auVar78),auVar235);
          uVar19 = vcmpps_avx512vl(auVar89,auVar153,1);
          bVar67 = (byte)uVar19 | ~bVar68;
          auVar154._8_4_ = 2;
          auVar154._0_8_ = 0x200000002;
          auVar154._12_4_ = 2;
          auVar154._16_4_ = 2;
          auVar154._20_4_ = 2;
          auVar154._24_4_ = 2;
          auVar154._28_4_ = 2;
          auVar32._8_4_ = 3;
          auVar32._0_8_ = 0x300000003;
          auVar32._12_4_ = 3;
          auVar32._16_4_ = 3;
          auVar32._20_4_ = 3;
          auVar32._24_4_ = 3;
          auVar32._28_4_ = 3;
          auVar89 = vpblendmd_avx512vl(auVar154,auVar32);
          local_400._0_4_ = (uint)(bVar67 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar67 & 1) * 2;
          bVar11 = (bool)(bVar67 >> 1 & 1);
          local_400._4_4_ = (uint)bVar11 * auVar89._4_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar67 >> 2 & 1);
          local_400._8_4_ = (uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar67 >> 3 & 1);
          local_400._12_4_ = (uint)bVar11 * auVar89._12_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar67 >> 4 & 1);
          local_400._16_4_ = (uint)bVar11 * auVar89._16_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar67 >> 5 & 1);
          local_400._20_4_ = (uint)bVar11 * auVar89._20_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar67 >> 6 & 1);
          local_400._24_4_ = (uint)bVar11 * auVar89._24_4_ | (uint)!bVar11 * 2;
          local_400._28_4_ = (uint)(bVar67 >> 7) * auVar89._28_4_ | (uint)!(bool)(bVar67 >> 7) * 2;
          local_5c0 = vpbroadcastd_avx512vl();
          uVar19 = vpcmpd_avx512vl(local_5c0,local_400,5);
          bVar67 = (byte)uVar19 & bVar65;
          if (bVar67 != 0) {
            auVar80 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar78 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar79 = vminps_avx(local_840._0_16_,local_880._0_16_);
            auVar87 = vminps_avx(auVar80,auVar79);
            auVar80 = vmaxps_avx(local_840._0_16_,local_880._0_16_);
            auVar79 = vmaxps_avx(auVar78,auVar80);
            auVar78 = vandps_avx(auVar259,auVar87);
            auVar80 = vandps_avx(auVar259,auVar79);
            auVar78 = vmaxps_avx(auVar78,auVar80);
            auVar80 = vmovshdup_avx(auVar78);
            auVar80 = vmaxss_avx(auVar80,auVar78);
            auVar78 = vshufpd_avx(auVar78,auVar78,1);
            auVar78 = vmaxss_avx(auVar78,auVar80);
            fVar247 = auVar78._0_4_ * 1.9073486e-06;
            local_7d0 = vshufps_avx(auVar79,auVar79,0xff);
            local_6a0 = (float)local_760._0_4_ + (float)local_740._0_4_;
            fStack_69c = (float)local_760._4_4_ + (float)local_740._4_4_;
            fStack_698 = fStack_758 + fStack_738;
            fStack_694 = fStack_754 + fStack_734;
            fStack_690 = fStack_750 + fStack_730;
            fStack_68c = fStack_74c + fStack_72c;
            fStack_688 = fStack_748 + fStack_728;
            fStack_684 = fStack_744 + fStack_724;
            do {
              auVar155._8_4_ = 0x7f800000;
              auVar155._0_8_ = 0x7f8000007f800000;
              auVar155._12_4_ = 0x7f800000;
              auVar155._16_4_ = 0x7f800000;
              auVar155._20_4_ = 0x7f800000;
              auVar155._24_4_ = 0x7f800000;
              auVar155._28_4_ = 0x7f800000;
              auVar89 = vblendmps_avx512vl(auVar155,_local_760);
              auVar126._0_4_ =
                   (uint)(bVar67 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
              bVar11 = (bool)(bVar67 >> 1 & 1);
              auVar126._4_4_ = (uint)bVar11 * auVar89._4_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar67 >> 2 & 1);
              auVar126._8_4_ = (uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar67 >> 3 & 1);
              auVar126._12_4_ = (uint)bVar11 * auVar89._12_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar67 >> 4 & 1);
              auVar126._16_4_ = (uint)bVar11 * auVar89._16_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar67 >> 5 & 1);
              auVar126._20_4_ = (uint)bVar11 * auVar89._20_4_ | (uint)!bVar11 * 0x7f800000;
              auVar126._24_4_ =
                   (uint)(bVar67 >> 6) * auVar89._24_4_ | (uint)!(bool)(bVar67 >> 6) * 0x7f800000;
              auVar126._28_4_ = 0x7f800000;
              auVar89 = vshufps_avx(auVar126,auVar126,0xb1);
              auVar89 = vminps_avx(auVar126,auVar89);
              auVar90 = vshufpd_avx(auVar89,auVar89,5);
              auVar89 = vminps_avx(auVar89,auVar90);
              auVar90 = vpermpd_avx2(auVar89,0x4e);
              auVar89 = vminps_avx(auVar89,auVar90);
              uVar19 = vcmpps_avx512vl(auVar126,auVar89,0);
              bVar62 = (byte)uVar19 & bVar67;
              bVar63 = bVar67;
              if (bVar62 != 0) {
                bVar63 = bVar62;
              }
              iVar2 = 0;
              for (uVar66 = (uint)bVar63; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar66 = *(uint *)(local_660 + (uint)(iVar2 << 2));
              fVar250 = *(float *)(local_1c0 + (uint)(iVar2 << 2));
              fVar251 = auVar75._0_4_;
              if ((float)local_8a0._0_4_ < 0.0) {
                fVar251 = sqrtf((float)local_8a0._0_4_);
              }
              auVar249 = ZEXT464(uVar66);
              lVar71 = 4;
              do {
                auVar142._4_4_ = fVar250;
                auVar142._0_4_ = fVar250;
                auVar142._8_4_ = fVar250;
                auVar142._12_4_ = fVar250;
                auVar78 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_890);
                fVar226 = auVar249._0_4_;
                fVar225 = 1.0 - fVar226;
                auVar82 = SUB6416(ZEXT464(0x40400000),0);
                auVar81 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar254 = auVar249._0_16_;
                auVar79 = vfmadd213ss_fma(auVar82,auVar254,auVar81);
                auVar80 = vfmadd213ss_fma(auVar79,ZEXT416((uint)(fVar226 * fVar226)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar87 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar225),auVar81);
                auVar87 = vfmadd213ss_fma(auVar87,ZEXT416((uint)(fVar225 * fVar225)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar252 = fVar225 * fVar225 * -fVar226 * 0.5;
                fVar236 = auVar80._0_4_ * 0.5;
                fVar221 = auVar87._0_4_ * 0.5;
                fVar224 = fVar226 * fVar226 * -fVar225 * 0.5;
                auVar199._0_4_ = fVar224 * (float)local_880._0_4_;
                auVar199._4_4_ = fVar224 * (float)local_880._4_4_;
                auVar199._8_4_ = fVar224 * fStack_878;
                auVar199._12_4_ = fVar224 * fStack_874;
                auVar213._4_4_ = fVar221;
                auVar213._0_4_ = fVar221;
                auVar213._8_4_ = fVar221;
                auVar213._12_4_ = fVar221;
                auVar80 = vfmadd132ps_fma(auVar213,auVar199,local_840._0_16_);
                auVar183._4_4_ = fVar236;
                auVar183._0_4_ = fVar236;
                auVar183._8_4_ = fVar236;
                auVar183._12_4_ = fVar236;
                auVar80 = vfmadd132ps_fma(auVar183,auVar80,local_860._0_16_);
                auVar200._4_4_ = fVar252;
                auVar200._0_4_ = fVar252;
                auVar200._8_4_ = fVar252;
                auVar200._12_4_ = fVar252;
                auVar80 = vfmadd132ps_fma(auVar200,auVar80,local_820._0_16_);
                auVar87 = vfmadd231ss_fma(auVar81,auVar254,ZEXT416(0x41100000));
                local_700._0_16_ = auVar87;
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar254,
                                          ZEXT416(0x40800000));
                local_720._0_16_ = auVar87;
                local_790 = vfmadd213ss_fma(auVar82,auVar254,ZEXT416(0xbf800000));
                local_6e0._0_16_ = auVar80;
                auVar80 = vsubps_avx(auVar78,auVar80);
                auVar78 = vdpps_avx(auVar80,auVar80,0x7f);
                fVar252 = auVar78._0_4_;
                if (fVar252 < 0.0) {
                  local_920._0_4_ = auVar79._0_4_;
                  local_940._0_16_ = ZEXT416((uint)fVar225);
                  auVar255._0_4_ = sqrtf(fVar252);
                  auVar255._4_60_ = extraout_var;
                  auVar79 = ZEXT416((uint)local_920._0_4_);
                  auVar87 = auVar255._0_16_;
                  auVar81 = local_940._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar78,auVar78);
                  auVar81 = ZEXT416((uint)fVar225);
                }
                fVar236 = auVar81._0_4_;
                auVar76 = vfnmadd231ss_fma(ZEXT416((uint)(fVar226 * (fVar236 + fVar236))),auVar81,
                                           auVar81);
                auVar79 = vfmadd213ss_fma(auVar79,ZEXT416((uint)(fVar226 + fVar226)),
                                          ZEXT416((uint)(fVar226 * fVar226 * 3.0)));
                auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar254,
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar236 * -3.0)),
                                          ZEXT416((uint)(fVar236 + fVar236)),auVar81);
                auVar81 = vfmadd213ss_fma(ZEXT416((uint)(fVar225 * -2.0)),auVar254,
                                          ZEXT416((uint)(fVar226 * fVar226)));
                fVar236 = auVar76._0_4_ * 0.5;
                fVar221 = auVar79._0_4_ * 0.5;
                fVar224 = auVar82._0_4_ * 0.5;
                fVar225 = auVar81._0_4_ * 0.5;
                auVar201._0_4_ = fVar225 * (float)local_880._0_4_;
                auVar201._4_4_ = fVar225 * (float)local_880._4_4_;
                auVar201._8_4_ = fVar225 * fStack_878;
                auVar201._12_4_ = fVar225 * fStack_874;
                auVar184._4_4_ = fVar224;
                auVar184._0_4_ = fVar224;
                auVar184._8_4_ = fVar224;
                auVar184._12_4_ = fVar224;
                auVar79 = vfmadd132ps_fma(auVar184,auVar201,local_840._0_16_);
                auVar162._4_4_ = fVar221;
                auVar162._0_4_ = fVar221;
                auVar162._8_4_ = fVar221;
                auVar162._12_4_ = fVar221;
                auVar79 = vfmadd132ps_fma(auVar162,auVar79,local_860._0_16_);
                auVar266._4_4_ = fVar236;
                auVar266._0_4_ = fVar236;
                auVar266._8_4_ = fVar236;
                auVar266._12_4_ = fVar236;
                local_920._0_16_ = vfmadd132ps_fma(auVar266,auVar79,local_820._0_16_);
                auVar79 = vdpps_avx(local_920._0_16_,local_920._0_16_,0x7f);
                auVar45._12_4_ = 0;
                auVar45._0_12_ = ZEXT812(0);
                fVar236 = auVar79._0_4_;
                auVar81 = vrsqrt14ss_avx512f(auVar45 << 0x20,ZEXT416((uint)fVar236));
                fVar221 = auVar81._0_4_;
                auVar82 = vrcp14ss_avx512f(auVar45 << 0x20,ZEXT416((uint)fVar236));
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar76 = vxorps_avx512vl(auVar79,auVar22);
                auVar81 = vfnmadd213ss_fma(auVar82,auVar79,SUB6416(ZEXT464(0x40000000),0));
                local_940._0_4_ = auVar87._0_4_;
                if (fVar236 < auVar76._0_4_) {
                  auVar270._0_4_ = sqrtf(fVar236);
                  auVar270._4_60_ = extraout_var_00;
                  auVar87 = ZEXT416((uint)local_940._0_4_);
                  auVar76 = auVar270._0_16_;
                  auVar79 = local_920._0_16_;
                }
                else {
                  auVar76 = vsqrtss_avx512f(auVar79,auVar79);
                  auVar79 = local_920._0_16_;
                }
                fVar221 = fVar221 * 1.5 + fVar236 * -0.5 * fVar221 * fVar221 * fVar221;
                auVar143._0_4_ = auVar79._0_4_ * fVar221;
                auVar143._4_4_ = auVar79._4_4_ * fVar221;
                auVar143._8_4_ = auVar79._8_4_ * fVar221;
                auVar143._12_4_ = auVar79._12_4_ * fVar221;
                auVar74 = vdpps_avx(auVar80,auVar143,0x7f);
                fVar227 = auVar87._0_4_;
                fVar224 = auVar74._0_4_;
                auVar144._0_4_ = fVar224 * fVar224;
                auVar144._4_4_ = auVar74._4_4_ * auVar74._4_4_;
                auVar144._8_4_ = auVar74._8_4_ * auVar74._8_4_;
                auVar144._12_4_ = auVar74._12_4_ * auVar74._12_4_;
                auVar83 = vsubps_avx512vl(auVar78,auVar144);
                fVar225 = auVar83._0_4_;
                auVar163._4_12_ = ZEXT812(0) << 0x20;
                auVar163._0_4_ = fVar225;
                auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar163);
                auVar85 = vmulss_avx512f(auVar84,ZEXT416(0x3fc00000));
                auVar86 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
                if (fVar225 < 0.0) {
                  local_7b0 = fVar221;
                  fStack_7ac = fVar221;
                  fStack_7a8 = fVar221;
                  fStack_7a4 = fVar221;
                  local_7a0 = auVar84;
                  fVar225 = sqrtf(fVar225);
                  auVar86 = ZEXT416(auVar86._0_4_);
                  auVar85 = ZEXT416(auVar85._0_4_);
                  auVar76 = ZEXT416(auVar76._0_4_);
                  auVar87 = ZEXT416((uint)local_940._0_4_);
                  auVar79 = local_920._0_16_;
                  auVar84 = local_7a0;
                  fVar221 = local_7b0;
                  fVar228 = fStack_7ac;
                  fVar229 = fStack_7a8;
                  fVar237 = fStack_7a4;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  fVar225 = auVar83._0_4_;
                  fVar228 = fVar221;
                  fVar229 = fVar221;
                  fVar237 = fVar221;
                }
                auVar272 = ZEXT1664(auVar74);
                auVar269 = ZEXT1664(auVar79);
                auVar260._8_4_ = 0x7fffffff;
                auVar260._0_8_ = 0x7fffffff7fffffff;
                auVar260._12_4_ = 0x7fffffff;
                auVar262 = ZEXT1664(auVar260);
                auVar274 = ZEXT3264(local_8c0);
                auVar164._0_4_ = (float)local_790._0_4_ * (float)local_880._0_4_;
                auVar164._4_4_ = (float)local_790._0_4_ * (float)local_880._4_4_;
                auVar164._8_4_ = (float)local_790._0_4_ * fStack_878;
                auVar164._12_4_ = (float)local_790._0_4_ * fStack_874;
                auVar185._4_4_ = local_720._0_4_;
                auVar185._0_4_ = local_720._0_4_;
                auVar185._8_4_ = local_720._0_4_;
                auVar185._12_4_ = local_720._0_4_;
                auVar83 = vfmadd132ps_fma(auVar185,auVar164,local_840._0_16_);
                auVar165._4_4_ = local_700._0_4_;
                auVar165._0_4_ = local_700._0_4_;
                auVar165._8_4_ = local_700._0_4_;
                auVar165._12_4_ = local_700._0_4_;
                auVar83 = vfmadd132ps_fma(auVar165,auVar83,local_860._0_16_);
                auVar254 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar254,
                                           ZEXT416(0x40000000));
                auVar186._0_4_ = auVar254._0_4_;
                auVar186._4_4_ = auVar186._0_4_;
                auVar186._8_4_ = auVar186._0_4_;
                auVar186._12_4_ = auVar186._0_4_;
                auVar254 = vfmadd132ps_fma(auVar186,auVar83,local_820._0_16_);
                auVar166._0_4_ = auVar254._0_4_ * fVar236;
                auVar166._4_4_ = auVar254._4_4_ * fVar236;
                auVar166._8_4_ = auVar254._8_4_ * fVar236;
                auVar166._12_4_ = auVar254._12_4_ * fVar236;
                auVar254 = vdpps_avx(auVar79,auVar254,0x7f);
                fVar236 = auVar254._0_4_;
                auVar187._0_4_ = auVar79._0_4_ * fVar236;
                auVar187._4_4_ = auVar79._4_4_ * fVar236;
                auVar187._8_4_ = auVar79._8_4_ * fVar236;
                auVar187._12_4_ = auVar79._12_4_ * fVar236;
                auVar254 = vsubps_avx(auVar166,auVar187);
                local_a00 = auVar82._0_4_;
                local_a00 = auVar81._0_4_ * local_a00;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar128._16_16_ = local_8c0._16_16_;
                auVar83 = vxorps_avx512vl(auVar79,auVar23);
                auVar214._0_4_ = fVar221 * auVar254._0_4_ * local_a00;
                auVar214._4_4_ = fVar228 * auVar254._4_4_ * local_a00;
                auVar214._8_4_ = fVar229 * auVar254._8_4_ * local_a00;
                auVar214._12_4_ = fVar237 * auVar254._12_4_ * local_a00;
                auVar81 = vdpps_avx(auVar83,auVar143,0x7f);
                auVar254 = vmaxss_avx(ZEXT416((uint)fVar247),
                                      ZEXT416((uint)(fVar250 * fVar251 * 1.9073486e-06)));
                auVar76 = vdivss_avx512f(ZEXT416((uint)fVar247),auVar76);
                auVar82 = vdpps_avx(auVar80,auVar214,0x7f);
                auVar87 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar247),auVar254);
                auVar76 = vfmadd213ss_fma(ZEXT416((uint)(fVar227 + 1.0)),auVar76,auVar87);
                auVar270 = ZEXT1664(auVar76);
                auVar87 = vdpps_avx(local_890,auVar143,0x7f);
                fVar236 = auVar81._0_4_ + auVar82._0_4_;
                auVar81 = vdpps_avx(auVar80,auVar83,0x7f);
                auVar83 = vmulss_avx512f(auVar86,auVar84);
                auVar84 = vmulss_avx512f(auVar84,auVar84);
                auVar82 = vdpps_avx(auVar80,local_890,0x7f);
                auVar85 = vaddss_avx512f(auVar85,ZEXT416((uint)(auVar83._0_4_ * auVar84._0_4_)));
                auVar84 = vfnmadd231ss_fma(auVar81,auVar74,ZEXT416((uint)fVar236));
                auVar83 = vfnmadd231ss_fma(auVar82,auVar74,auVar87);
                auVar81 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar225 = fVar225 - auVar81._0_4_;
                auVar81 = vshufps_avx(auVar79,auVar79,0xff);
                auVar82 = vfmsub213ss_fma(auVar84,auVar85,auVar81);
                fVar221 = auVar83._0_4_ * auVar85._0_4_;
                auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar82._0_4_)),
                                          ZEXT416((uint)fVar236),ZEXT416((uint)fVar221));
                fVar227 = auVar84._0_4_;
                fVar226 = fVar226 - (fVar224 * (fVar221 / fVar227) -
                                    fVar225 * (auVar87._0_4_ / fVar227));
                auVar249 = ZEXT464((uint)fVar226);
                fVar250 = fVar250 - (fVar225 * (fVar236 / fVar227) -
                                    fVar224 * (auVar82._0_4_ / fVar227));
                auVar87 = vandps_avx(auVar74,auVar260);
                if (auVar76._0_4_ <= auVar87._0_4_) {
LAB_01b53e30:
                  bVar11 = false;
                }
                else {
                  auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ + auVar254._0_4_)),
                                            local_7d0,ZEXT416(0x36000000));
                  auVar87 = vandps_avx(auVar260,ZEXT416((uint)fVar225));
                  if (auVar82._0_4_ <= auVar87._0_4_) goto LAB_01b53e30;
                  fVar250 = fVar250 + (float)local_7c0._0_4_;
                  bVar11 = true;
                  if ((((fVar140 <= fVar250) &&
                       (fVar236 = *(float *)(ray + k * 4 + 0x100), fVar250 <= fVar236)) &&
                      (0.0 <= fVar226)) && (fVar226 <= 1.0)) {
                    auVar128._0_16_ = ZEXT816(0) << 0x20;
                    auVar127._4_28_ = auVar128._4_28_;
                    auVar127._0_4_ = fVar252;
                    auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar127._0_16_);
                    fVar252 = auVar87._0_4_;
                    auVar78 = vmulss_avx512f(auVar78,ZEXT416(0xbf000000));
                    pGVar8 = (context->scene->geometries).items[uVar70].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar252 = fVar252 * 1.5 + auVar78._0_4_ * fVar252 * fVar252 * fVar252;
                      auVar167._0_4_ = auVar80._0_4_ * fVar252;
                      auVar167._4_4_ = auVar80._4_4_ * fVar252;
                      auVar167._8_4_ = auVar80._8_4_ * fVar252;
                      auVar167._12_4_ = auVar80._12_4_ * fVar252;
                      auVar81 = vfmadd213ps_fma(auVar81,auVar167,auVar79);
                      auVar78 = vshufps_avx(auVar167,auVar167,0xc9);
                      auVar80 = vshufps_avx(auVar79,auVar79,0xc9);
                      auVar168._0_4_ = auVar167._0_4_ * auVar80._0_4_;
                      auVar168._4_4_ = auVar167._4_4_ * auVar80._4_4_;
                      auVar168._8_4_ = auVar167._8_4_ * auVar80._8_4_;
                      auVar168._12_4_ = auVar167._12_4_ * auVar80._12_4_;
                      auVar87 = vfmsub231ps_fma(auVar168,auVar79,auVar78);
                      auVar78 = vshufps_avx(auVar87,auVar87,0xc9);
                      auVar80 = vshufps_avx(auVar81,auVar81,0xc9);
                      auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                      auVar145._0_4_ = auVar81._0_4_ * auVar87._0_4_;
                      auVar145._4_4_ = auVar81._4_4_ * auVar87._4_4_;
                      auVar145._8_4_ = auVar81._8_4_ * auVar87._8_4_;
                      auVar145._12_4_ = auVar81._12_4_ * auVar87._12_4_;
                      auVar78 = vfmsub231ps_fma(auVar145,auVar78,auVar80);
                      uVar141 = auVar78._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar250;
                        uVar7 = vextractps_avx(auVar78,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar7;
                        uVar7 = vextractps_avx(auVar78,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar7;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar141;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar226;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar6;
                        *(uint *)(ray + k * 4 + 0x240) = uVar70;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar10 = context->user;
                        auVar193._8_4_ = 1;
                        auVar193._0_8_ = 0x100000001;
                        auVar193._12_4_ = 1;
                        auVar193._16_4_ = 1;
                        auVar193._20_4_ = 1;
                        auVar193._24_4_ = 1;
                        auVar193._28_4_ = 1;
                        auVar89 = vpermps_avx2(auVar193,ZEXT1632(auVar78));
                        auVar208._8_4_ = 2;
                        auVar208._0_8_ = 0x200000002;
                        auVar208._12_4_ = 2;
                        auVar208._16_4_ = 2;
                        auVar208._20_4_ = 2;
                        auVar208._24_4_ = 2;
                        auVar208._28_4_ = 2;
                        local_540 = vpermps_avx2(auVar208,ZEXT1632(auVar78));
                        local_560[0] = (RTCHitN)auVar89[0];
                        local_560[1] = (RTCHitN)auVar89[1];
                        local_560[2] = (RTCHitN)auVar89[2];
                        local_560[3] = (RTCHitN)auVar89[3];
                        local_560[4] = (RTCHitN)auVar89[4];
                        local_560[5] = (RTCHitN)auVar89[5];
                        local_560[6] = (RTCHitN)auVar89[6];
                        local_560[7] = (RTCHitN)auVar89[7];
                        local_560[8] = (RTCHitN)auVar89[8];
                        local_560[9] = (RTCHitN)auVar89[9];
                        local_560[10] = (RTCHitN)auVar89[10];
                        local_560[0xb] = (RTCHitN)auVar89[0xb];
                        local_560[0xc] = (RTCHitN)auVar89[0xc];
                        local_560[0xd] = (RTCHitN)auVar89[0xd];
                        local_560[0xe] = (RTCHitN)auVar89[0xe];
                        local_560[0xf] = (RTCHitN)auVar89[0xf];
                        local_560[0x10] = (RTCHitN)auVar89[0x10];
                        local_560[0x11] = (RTCHitN)auVar89[0x11];
                        local_560[0x12] = (RTCHitN)auVar89[0x12];
                        local_560[0x13] = (RTCHitN)auVar89[0x13];
                        local_560[0x14] = (RTCHitN)auVar89[0x14];
                        local_560[0x15] = (RTCHitN)auVar89[0x15];
                        local_560[0x16] = (RTCHitN)auVar89[0x16];
                        local_560[0x17] = (RTCHitN)auVar89[0x17];
                        local_560[0x18] = (RTCHitN)auVar89[0x18];
                        local_560[0x19] = (RTCHitN)auVar89[0x19];
                        local_560[0x1a] = (RTCHitN)auVar89[0x1a];
                        local_560[0x1b] = (RTCHitN)auVar89[0x1b];
                        local_560[0x1c] = (RTCHitN)auVar89[0x1c];
                        local_560[0x1d] = (RTCHitN)auVar89[0x1d];
                        local_560[0x1e] = (RTCHitN)auVar89[0x1e];
                        local_560[0x1f] = (RTCHitN)auVar89[0x1f];
                        local_520 = uVar141;
                        uStack_51c = uVar141;
                        uStack_518 = uVar141;
                        uStack_514 = uVar141;
                        uStack_510 = uVar141;
                        uStack_50c = uVar141;
                        uStack_508 = uVar141;
                        uStack_504 = uVar141;
                        local_500 = fVar226;
                        fStack_4fc = fVar226;
                        fStack_4f8 = fVar226;
                        fStack_4f4 = fVar226;
                        fStack_4f0 = fVar226;
                        fStack_4ec = fVar226;
                        fStack_4e8 = fVar226;
                        fStack_4e4 = fVar226;
                        local_4e0 = ZEXT432(0) << 0x20;
                        local_4c0 = local_600._0_8_;
                        uStack_4b8 = local_600._8_8_;
                        uStack_4b0 = local_600._16_8_;
                        uStack_4a8 = local_600._24_8_;
                        local_4a0 = local_5e0;
                        auVar89 = vpcmpeqd_avx2(local_5e0,local_5e0);
                        local_8e8[1] = auVar89;
                        *local_8e8 = auVar89;
                        local_480 = pRVar10->instID[0];
                        uStack_47c = local_480;
                        uStack_478 = local_480;
                        uStack_474 = local_480;
                        uStack_470 = local_480;
                        uStack_46c = local_480;
                        uStack_468 = local_480;
                        uStack_464 = local_480;
                        local_460 = pRVar10->instPrimID[0];
                        uStack_45c = local_460;
                        uStack_458 = local_460;
                        uStack_454 = local_460;
                        uStack_450 = local_460;
                        uStack_44c = local_460;
                        uStack_448 = local_460;
                        uStack_444 = local_460;
                        *(float *)(ray + k * 4 + 0x100) = fVar250;
                        local_800 = local_620._0_8_;
                        uStack_7f8 = local_620._8_8_;
                        uStack_7f0 = local_620._16_8_;
                        uStack_7e8 = local_620._24_8_;
                        local_970.valid = (int *)&local_800;
                        local_970.geometryUserPtr = pGVar8->userPtr;
                        local_970.context = context->user;
                        local_970.hit = local_560;
                        local_970.N = 8;
                        local_970.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar269 = ZEXT1664(auVar79);
                          auVar270 = ZEXT1664(auVar76);
                          auVar272 = ZEXT1664(auVar74);
                          (*pGVar8->intersectionFilterN)(&local_970);
                          auVar249 = ZEXT1664(ZEXT416((uint)fVar226));
                          auVar274 = ZEXT3264(local_8c0);
                          auVar262 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar51._8_8_ = uStack_7f8;
                        auVar51._0_8_ = local_800;
                        auVar51._16_8_ = uStack_7f0;
                        auVar51._24_8_ = uStack_7e8;
                        if (auVar51 != (undefined1  [32])0x0) {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar269 = ZEXT1664(auVar269._0_16_);
                            auVar270 = ZEXT1664(auVar270._0_16_);
                            auVar272 = ZEXT1664(auVar272._0_16_);
                            (*p_Var9)(&local_970);
                            auVar249 = ZEXT1664(ZEXT416((uint)fVar226));
                            auVar274 = ZEXT3264(local_8c0);
                            auVar262 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar52._8_8_ = uStack_7f8;
                          auVar52._0_8_ = local_800;
                          auVar52._16_8_ = uStack_7f0;
                          auVar52._24_8_ = uStack_7e8;
                          if (auVar52 != (undefined1  [32])0x0) {
                            uVar73 = vptestmd_avx512vl(auVar52,auVar52);
                            iVar3 = *(int *)(local_970.hit + 4);
                            iVar4 = *(int *)(local_970.hit + 8);
                            iVar1 = *(int *)(local_970.hit + 0xc);
                            iVar47 = *(int *)(local_970.hit + 0x10);
                            iVar48 = *(int *)(local_970.hit + 0x14);
                            iVar49 = *(int *)(local_970.hit + 0x18);
                            iVar50 = *(int *)(local_970.hit + 0x1c);
                            bVar63 = (byte)uVar73;
                            bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                            bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                            bVar17 = SUB81(uVar73 >> 7,0);
                            *(uint *)(local_970.ray + 0x180) =
                                 (uint)(bVar63 & 1) * *(int *)local_970.hit |
                                 (uint)!(bool)(bVar63 & 1) * *(int *)(local_970.ray + 0x180);
                            *(uint *)(local_970.ray + 0x184) =
                                 (uint)bVar72 * iVar3 |
                                 (uint)!bVar72 * *(int *)(local_970.ray + 0x184);
                            *(uint *)(local_970.ray + 0x188) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_970.ray + 0x188);
                            *(uint *)(local_970.ray + 0x18c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_970.ray + 0x18c);
                            *(uint *)(local_970.ray + 400) =
                                 (uint)bVar15 * iVar47 |
                                 (uint)!bVar15 * *(int *)(local_970.ray + 400);
                            *(uint *)(local_970.ray + 0x194) =
                                 (uint)bVar14 * iVar48 |
                                 (uint)!bVar14 * *(int *)(local_970.ray + 0x194);
                            *(uint *)(local_970.ray + 0x198) =
                                 (uint)bVar16 * iVar49 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x198);
                            *(uint *)(local_970.ray + 0x19c) =
                                 (uint)bVar17 * iVar50 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x19c);
                            iVar3 = *(int *)(local_970.hit + 0x24);
                            iVar4 = *(int *)(local_970.hit + 0x28);
                            iVar1 = *(int *)(local_970.hit + 0x2c);
                            iVar47 = *(int *)(local_970.hit + 0x30);
                            iVar48 = *(int *)(local_970.hit + 0x34);
                            iVar49 = *(int *)(local_970.hit + 0x38);
                            iVar50 = *(int *)(local_970.hit + 0x3c);
                            bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                            bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                            bVar17 = SUB81(uVar73 >> 7,0);
                            *(uint *)(local_970.ray + 0x1a0) =
                                 (uint)(bVar63 & 1) * *(int *)(local_970.hit + 0x20) |
                                 (uint)!(bool)(bVar63 & 1) * *(int *)(local_970.ray + 0x1a0);
                            *(uint *)(local_970.ray + 0x1a4) =
                                 (uint)bVar72 * iVar3 |
                                 (uint)!bVar72 * *(int *)(local_970.ray + 0x1a4);
                            *(uint *)(local_970.ray + 0x1a8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_970.ray + 0x1a8);
                            *(uint *)(local_970.ray + 0x1ac) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_970.ray + 0x1ac);
                            *(uint *)(local_970.ray + 0x1b0) =
                                 (uint)bVar15 * iVar47 |
                                 (uint)!bVar15 * *(int *)(local_970.ray + 0x1b0);
                            *(uint *)(local_970.ray + 0x1b4) =
                                 (uint)bVar14 * iVar48 |
                                 (uint)!bVar14 * *(int *)(local_970.ray + 0x1b4);
                            *(uint *)(local_970.ray + 0x1b8) =
                                 (uint)bVar16 * iVar49 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x1b8);
                            *(uint *)(local_970.ray + 0x1bc) =
                                 (uint)bVar17 * iVar50 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x1bc);
                            iVar3 = *(int *)(local_970.hit + 0x44);
                            iVar4 = *(int *)(local_970.hit + 0x48);
                            iVar1 = *(int *)(local_970.hit + 0x4c);
                            iVar47 = *(int *)(local_970.hit + 0x50);
                            iVar48 = *(int *)(local_970.hit + 0x54);
                            iVar49 = *(int *)(local_970.hit + 0x58);
                            iVar50 = *(int *)(local_970.hit + 0x5c);
                            bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                            bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                            bVar17 = SUB81(uVar73 >> 7,0);
                            *(uint *)(local_970.ray + 0x1c0) =
                                 (uint)(bVar63 & 1) * *(int *)(local_970.hit + 0x40) |
                                 (uint)!(bool)(bVar63 & 1) * *(int *)(local_970.ray + 0x1c0);
                            *(uint *)(local_970.ray + 0x1c4) =
                                 (uint)bVar72 * iVar3 |
                                 (uint)!bVar72 * *(int *)(local_970.ray + 0x1c4);
                            *(uint *)(local_970.ray + 0x1c8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_970.ray + 0x1c8);
                            *(uint *)(local_970.ray + 0x1cc) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_970.ray + 0x1cc);
                            *(uint *)(local_970.ray + 0x1d0) =
                                 (uint)bVar15 * iVar47 |
                                 (uint)!bVar15 * *(int *)(local_970.ray + 0x1d0);
                            *(uint *)(local_970.ray + 0x1d4) =
                                 (uint)bVar14 * iVar48 |
                                 (uint)!bVar14 * *(int *)(local_970.ray + 0x1d4);
                            *(uint *)(local_970.ray + 0x1d8) =
                                 (uint)bVar16 * iVar49 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x1d8);
                            *(uint *)(local_970.ray + 0x1dc) =
                                 (uint)bVar17 * iVar50 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x1dc);
                            iVar3 = *(int *)(local_970.hit + 100);
                            iVar4 = *(int *)(local_970.hit + 0x68);
                            iVar1 = *(int *)(local_970.hit + 0x6c);
                            iVar47 = *(int *)(local_970.hit + 0x70);
                            iVar48 = *(int *)(local_970.hit + 0x74);
                            iVar49 = *(int *)(local_970.hit + 0x78);
                            iVar50 = *(int *)(local_970.hit + 0x7c);
                            bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                            bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                            bVar17 = SUB81(uVar73 >> 7,0);
                            *(uint *)(local_970.ray + 0x1e0) =
                                 (uint)(bVar63 & 1) * *(int *)(local_970.hit + 0x60) |
                                 (uint)!(bool)(bVar63 & 1) * *(int *)(local_970.ray + 0x1e0);
                            *(uint *)(local_970.ray + 0x1e4) =
                                 (uint)bVar72 * iVar3 |
                                 (uint)!bVar72 * *(int *)(local_970.ray + 0x1e4);
                            *(uint *)(local_970.ray + 0x1e8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_970.ray + 0x1e8);
                            *(uint *)(local_970.ray + 0x1ec) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_970.ray + 0x1ec);
                            *(uint *)(local_970.ray + 0x1f0) =
                                 (uint)bVar15 * iVar47 |
                                 (uint)!bVar15 * *(int *)(local_970.ray + 0x1f0);
                            *(uint *)(local_970.ray + 500) =
                                 (uint)bVar14 * iVar48 |
                                 (uint)!bVar14 * *(int *)(local_970.ray + 500);
                            *(uint *)(local_970.ray + 0x1f8) =
                                 (uint)bVar16 * iVar49 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x1f8);
                            *(uint *)(local_970.ray + 0x1fc) =
                                 (uint)bVar17 * iVar50 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x1fc);
                            iVar3 = *(int *)(local_970.hit + 0x84);
                            iVar4 = *(int *)(local_970.hit + 0x88);
                            iVar1 = *(int *)(local_970.hit + 0x8c);
                            iVar47 = *(int *)(local_970.hit + 0x90);
                            iVar48 = *(int *)(local_970.hit + 0x94);
                            iVar49 = *(int *)(local_970.hit + 0x98);
                            iVar50 = *(int *)(local_970.hit + 0x9c);
                            bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                            bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                            bVar17 = SUB81(uVar73 >> 7,0);
                            *(uint *)(local_970.ray + 0x200) =
                                 (uint)(bVar63 & 1) * *(int *)(local_970.hit + 0x80) |
                                 (uint)!(bool)(bVar63 & 1) * *(int *)(local_970.ray + 0x200);
                            *(uint *)(local_970.ray + 0x204) =
                                 (uint)bVar72 * iVar3 |
                                 (uint)!bVar72 * *(int *)(local_970.ray + 0x204);
                            *(uint *)(local_970.ray + 0x208) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_970.ray + 0x208);
                            *(uint *)(local_970.ray + 0x20c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_970.ray + 0x20c);
                            *(uint *)(local_970.ray + 0x210) =
                                 (uint)bVar15 * iVar47 |
                                 (uint)!bVar15 * *(int *)(local_970.ray + 0x210);
                            *(uint *)(local_970.ray + 0x214) =
                                 (uint)bVar14 * iVar48 |
                                 (uint)!bVar14 * *(int *)(local_970.ray + 0x214);
                            *(uint *)(local_970.ray + 0x218) =
                                 (uint)bVar16 * iVar49 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x218);
                            *(uint *)(local_970.ray + 0x21c) =
                                 (uint)bVar17 * iVar50 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x21c);
                            auVar89 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0xa0));
                            *(undefined1 (*) [32])(local_970.ray + 0x220) = auVar89;
                            auVar89 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0xc0));
                            *(undefined1 (*) [32])(local_970.ray + 0x240) = auVar89;
                            auVar89 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0xe0));
                            *(undefined1 (*) [32])(local_970.ray + 0x260) = auVar89;
                            auVar89 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0x100));
                            *(undefined1 (*) [32])(local_970.ray + 0x280) = auVar89;
                            goto LAB_01b53e33;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar236;
                      }
                    }
                  }
                }
LAB_01b53e33:
                bVar72 = lVar71 != 0;
                lVar71 = lVar71 + -1;
              } while ((!bVar11) && (bVar72));
              auVar55._4_4_ = fStack_69c;
              auVar55._0_4_ = local_6a0;
              auVar55._8_4_ = fStack_698;
              auVar55._12_4_ = fStack_694;
              auVar55._16_4_ = fStack_690;
              auVar55._20_4_ = fStack_68c;
              auVar55._24_4_ = fStack_688;
              auVar55._28_4_ = fStack_684;
              uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar33._4_4_ = uVar141;
              auVar33._0_4_ = uVar141;
              auVar33._8_4_ = uVar141;
              auVar33._12_4_ = uVar141;
              auVar33._16_4_ = uVar141;
              auVar33._20_4_ = uVar141;
              auVar33._24_4_ = uVar141;
              auVar33._28_4_ = uVar141;
              uVar19 = vcmpps_avx512vl(auVar55,auVar33,2);
              bVar67 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar67 & (byte)uVar19;
            } while (bVar67 != 0);
          }
          auVar156._0_4_ = (float)local_6c0._0_4_ + (float)local_740._0_4_;
          auVar156._4_4_ = (float)local_6c0._4_4_ + (float)local_740._4_4_;
          auVar156._8_4_ = fStack_6b8 + fStack_738;
          auVar156._12_4_ = fStack_6b4 + fStack_734;
          auVar156._16_4_ = fStack_6b0 + fStack_730;
          auVar156._20_4_ = fStack_6ac + fStack_72c;
          auVar156._24_4_ = fStack_6a8 + fStack_728;
          auVar156._28_4_ = fStack_6a4 + fStack_724;
          uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar34._4_4_ = uVar141;
          auVar34._0_4_ = uVar141;
          auVar34._8_4_ = uVar141;
          auVar34._12_4_ = uVar141;
          auVar34._16_4_ = uVar141;
          auVar34._20_4_ = uVar141;
          auVar34._24_4_ = uVar141;
          auVar34._28_4_ = uVar141;
          uVar19 = vcmpps_avx512vl(auVar156,auVar34,2);
          bVar68 = (byte)uVar18 | ~bVar68;
          bVar61 = (byte)uVar20 & bVar61 & (byte)uVar19;
          auVar157._8_4_ = 2;
          auVar157._0_8_ = 0x200000002;
          auVar157._12_4_ = 2;
          auVar157._16_4_ = 2;
          auVar157._20_4_ = 2;
          auVar157._24_4_ = 2;
          auVar157._28_4_ = 2;
          auVar35._8_4_ = 3;
          auVar35._0_8_ = 0x300000003;
          auVar35._12_4_ = 3;
          auVar35._16_4_ = 3;
          auVar35._20_4_ = 3;
          auVar35._24_4_ = 3;
          auVar35._28_4_ = 3;
          auVar89 = vpblendmd_avx512vl(auVar157,auVar35);
          local_6c0._0_4_ = (uint)(bVar68 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar68 & 1) * 2;
          bVar11 = (bool)(bVar68 >> 1 & 1);
          local_6c0._4_4_ = (uint)bVar11 * auVar89._4_4_ | (uint)!bVar11 * 2;
          bVar11 = (bool)(bVar68 >> 2 & 1);
          fStack_6b8 = (float)((uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * 2);
          bVar11 = (bool)(bVar68 >> 3 & 1);
          fStack_6b4 = (float)((uint)bVar11 * auVar89._12_4_ | (uint)!bVar11 * 2);
          bVar11 = (bool)(bVar68 >> 4 & 1);
          fStack_6b0 = (float)((uint)bVar11 * auVar89._16_4_ | (uint)!bVar11 * 2);
          bVar11 = (bool)(bVar68 >> 5 & 1);
          fStack_6ac = (float)((uint)bVar11 * auVar89._20_4_ | (uint)!bVar11 * 2);
          bVar11 = (bool)(bVar68 >> 6 & 1);
          fStack_6a8 = (float)((uint)bVar11 * auVar89._24_4_ | (uint)!bVar11 * 2);
          fStack_6a4 = (float)((uint)(bVar68 >> 7) * auVar89._28_4_ | (uint)!(bool)(bVar68 >> 7) * 2
                              );
          uVar18 = vpcmpd_avx512vl(_local_6c0,local_5c0,2);
          bVar68 = (byte)uVar18 & bVar61;
          if (bVar68 != 0) {
            auVar80 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar78 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar79 = vminps_avx(local_840._0_16_,local_880._0_16_);
            auVar87 = vminps_avx(auVar80,auVar79);
            auVar80 = vmaxps_avx(local_840._0_16_,local_880._0_16_);
            auVar79 = vmaxps_avx(auVar78,auVar80);
            auVar78 = vandps_avx(auVar262._0_16_,auVar87);
            auVar80 = vandps_avx(auVar262._0_16_,auVar79);
            auVar78 = vmaxps_avx(auVar78,auVar80);
            auVar80 = vmovshdup_avx(auVar78);
            auVar80 = vmaxss_avx(auVar80,auVar78);
            auVar78 = vshufpd_avx(auVar78,auVar78,1);
            auVar78 = vmaxss_avx(auVar78,auVar80);
            fVar247 = auVar78._0_4_ * 1.9073486e-06;
            local_7d0 = vshufps_avx(auVar79,auVar79,0xff);
            _local_760 = _local_440;
            local_6a0 = (float)local_440._0_4_ + (float)local_740._0_4_;
            fStack_69c = (float)local_440._4_4_ + (float)local_740._4_4_;
            fStack_698 = fStack_438 + fStack_738;
            fStack_694 = fStack_434 + fStack_734;
            fStack_690 = fStack_430 + fStack_730;
            fStack_68c = fStack_42c + fStack_72c;
            fStack_688 = fStack_428 + fStack_728;
            fStack_684 = fStack_424 + fStack_724;
            do {
              auVar158._8_4_ = 0x7f800000;
              auVar158._0_8_ = 0x7f8000007f800000;
              auVar158._12_4_ = 0x7f800000;
              auVar158._16_4_ = 0x7f800000;
              auVar158._20_4_ = 0x7f800000;
              auVar158._24_4_ = 0x7f800000;
              auVar158._28_4_ = 0x7f800000;
              auVar89 = vblendmps_avx512vl(auVar158,_local_760);
              auVar129._0_4_ =
                   (uint)(bVar68 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
              bVar11 = (bool)(bVar68 >> 1 & 1);
              auVar129._4_4_ = (uint)bVar11 * auVar89._4_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar68 >> 2 & 1);
              auVar129._8_4_ = (uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar68 >> 3 & 1);
              auVar129._12_4_ = (uint)bVar11 * auVar89._12_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar68 >> 4 & 1);
              auVar129._16_4_ = (uint)bVar11 * auVar89._16_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar68 >> 5 & 1);
              auVar129._20_4_ = (uint)bVar11 * auVar89._20_4_ | (uint)!bVar11 * 0x7f800000;
              auVar129._24_4_ =
                   (uint)(bVar68 >> 6) * auVar89._24_4_ | (uint)!(bool)(bVar68 >> 6) * 0x7f800000;
              auVar129._28_4_ = 0x7f800000;
              auVar89 = vshufps_avx(auVar129,auVar129,0xb1);
              auVar89 = vminps_avx(auVar129,auVar89);
              auVar90 = vshufpd_avx(auVar89,auVar89,5);
              auVar89 = vminps_avx(auVar89,auVar90);
              auVar90 = vpermpd_avx2(auVar89,0x4e);
              auVar89 = vminps_avx(auVar89,auVar90);
              uVar18 = vcmpps_avx512vl(auVar129,auVar89,0);
              bVar63 = (byte)uVar18 & bVar68;
              bVar67 = bVar68;
              if (bVar63 != 0) {
                bVar67 = bVar63;
              }
              iVar2 = 0;
              for (uVar66 = (uint)bVar67; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar66 = *(uint *)(local_680 + (uint)(iVar2 << 2));
              fVar250 = *(float *)(local_420 + (uint)(iVar2 << 2));
              fVar251 = auVar77._0_4_;
              if ((float)local_8a0._0_4_ < 0.0) {
                fVar251 = sqrtf((float)local_8a0._0_4_);
              }
              auVar249 = ZEXT464(uVar66);
              lVar71 = 4;
              do {
                auVar146._4_4_ = fVar250;
                auVar146._0_4_ = fVar250;
                auVar146._8_4_ = fVar250;
                auVar146._12_4_ = fVar250;
                auVar78 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_890);
                fVar226 = auVar249._0_4_;
                fVar225 = 1.0 - fVar226;
                auVar82 = SUB6416(ZEXT464(0x40400000),0);
                auVar81 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar254 = auVar249._0_16_;
                auVar79 = vfmadd213ss_fma(auVar82,auVar254,auVar81);
                auVar80 = vfmadd213ss_fma(auVar79,ZEXT416((uint)(fVar226 * fVar226)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar87 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar225),auVar81);
                auVar87 = vfmadd213ss_fma(auVar87,ZEXT416((uint)(fVar225 * fVar225)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar252 = fVar225 * fVar225 * -fVar226 * 0.5;
                fVar236 = auVar80._0_4_ * 0.5;
                fVar221 = auVar87._0_4_ * 0.5;
                fVar224 = fVar226 * fVar226 * -fVar225 * 0.5;
                auVar202._0_4_ = fVar224 * (float)local_880._0_4_;
                auVar202._4_4_ = fVar224 * (float)local_880._4_4_;
                auVar202._8_4_ = fVar224 * fStack_878;
                auVar202._12_4_ = fVar224 * fStack_874;
                auVar215._4_4_ = fVar221;
                auVar215._0_4_ = fVar221;
                auVar215._8_4_ = fVar221;
                auVar215._12_4_ = fVar221;
                auVar80 = vfmadd132ps_fma(auVar215,auVar202,local_840._0_16_);
                auVar188._4_4_ = fVar236;
                auVar188._0_4_ = fVar236;
                auVar188._8_4_ = fVar236;
                auVar188._12_4_ = fVar236;
                auVar80 = vfmadd132ps_fma(auVar188,auVar80,local_860._0_16_);
                auVar203._4_4_ = fVar252;
                auVar203._0_4_ = fVar252;
                auVar203._8_4_ = fVar252;
                auVar203._12_4_ = fVar252;
                auVar80 = vfmadd132ps_fma(auVar203,auVar80,local_820._0_16_);
                auVar87 = vfmadd231ss_fma(auVar81,auVar254,ZEXT416(0x41100000));
                local_700._0_16_ = auVar87;
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar254,
                                          ZEXT416(0x40800000));
                local_720._0_16_ = auVar87;
                local_790 = vfmadd213ss_fma(auVar82,auVar254,ZEXT416(0xbf800000));
                local_6e0._0_16_ = auVar80;
                auVar80 = vsubps_avx(auVar78,auVar80);
                auVar78 = vdpps_avx(auVar80,auVar80,0x7f);
                fVar252 = auVar78._0_4_;
                if (fVar252 < 0.0) {
                  local_920._0_4_ = auVar79._0_4_;
                  local_940._0_16_ = ZEXT416((uint)fVar225);
                  auVar272._0_4_ = sqrtf(fVar252);
                  auVar272._4_60_ = extraout_var_01;
                  auVar79 = ZEXT416((uint)local_920._0_4_);
                  auVar87 = auVar272._0_16_;
                  auVar81 = local_940._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar78,auVar78);
                  auVar81 = ZEXT416((uint)fVar225);
                }
                fVar236 = auVar81._0_4_;
                auVar76 = vfnmadd231ss_fma(ZEXT416((uint)(fVar226 * (fVar236 + fVar236))),auVar81,
                                           auVar81);
                auVar79 = vfmadd213ss_fma(auVar79,ZEXT416((uint)(fVar226 + fVar226)),
                                          ZEXT416((uint)(fVar226 * fVar226 * 3.0)));
                auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar254,
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar236 * -3.0)),
                                          ZEXT416((uint)(fVar236 + fVar236)),auVar81);
                auVar81 = vfmadd213ss_fma(ZEXT416((uint)(fVar225 * -2.0)),auVar254,
                                          ZEXT416((uint)(fVar226 * fVar226)));
                fVar236 = auVar76._0_4_ * 0.5;
                fVar221 = auVar79._0_4_ * 0.5;
                fVar224 = auVar82._0_4_ * 0.5;
                fVar225 = auVar81._0_4_ * 0.5;
                auVar204._0_4_ = fVar225 * (float)local_880._0_4_;
                auVar204._4_4_ = fVar225 * (float)local_880._4_4_;
                auVar204._8_4_ = fVar225 * fStack_878;
                auVar204._12_4_ = fVar225 * fStack_874;
                auVar189._4_4_ = fVar224;
                auVar189._0_4_ = fVar224;
                auVar189._8_4_ = fVar224;
                auVar189._12_4_ = fVar224;
                auVar79 = vfmadd132ps_fma(auVar189,auVar204,local_840._0_16_);
                auVar169._4_4_ = fVar221;
                auVar169._0_4_ = fVar221;
                auVar169._8_4_ = fVar221;
                auVar169._12_4_ = fVar221;
                auVar79 = vfmadd132ps_fma(auVar169,auVar79,local_860._0_16_);
                auVar267._4_4_ = fVar236;
                auVar267._0_4_ = fVar236;
                auVar267._8_4_ = fVar236;
                auVar267._12_4_ = fVar236;
                local_920._0_16_ = vfmadd132ps_fma(auVar267,auVar79,local_820._0_16_);
                auVar79 = vdpps_avx(local_920._0_16_,local_920._0_16_,0x7f);
                auVar46._12_4_ = 0;
                auVar46._0_12_ = ZEXT812(0);
                fVar236 = auVar79._0_4_;
                auVar81 = vrsqrt14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar236));
                fVar221 = auVar81._0_4_;
                auVar82 = vrcp14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar236));
                auVar24._8_4_ = 0x80000000;
                auVar24._0_8_ = 0x8000000080000000;
                auVar24._12_4_ = 0x80000000;
                auVar76 = vxorps_avx512vl(auVar79,auVar24);
                auVar81 = vfnmadd213ss_fma(auVar82,auVar79,SUB6416(ZEXT464(0x40000000),0));
                local_940._0_4_ = auVar87._0_4_;
                if (fVar236 < auVar76._0_4_) {
                  auVar274._0_4_ = sqrtf(fVar236);
                  auVar274._4_60_ = extraout_var_02;
                  auVar87 = ZEXT416((uint)local_940._0_4_);
                  auVar76 = auVar274._0_16_;
                  auVar79 = local_920._0_16_;
                }
                else {
                  auVar76 = vsqrtss_avx512f(auVar79,auVar79);
                  auVar79 = local_920._0_16_;
                }
                fVar221 = fVar221 * 1.5 + fVar236 * -0.5 * fVar221 * fVar221 * fVar221;
                auVar147._0_4_ = auVar79._0_4_ * fVar221;
                auVar147._4_4_ = auVar79._4_4_ * fVar221;
                auVar147._8_4_ = auVar79._8_4_ * fVar221;
                auVar147._12_4_ = auVar79._12_4_ * fVar221;
                auVar74 = vdpps_avx(auVar80,auVar147,0x7f);
                fVar227 = auVar87._0_4_;
                fVar224 = auVar74._0_4_;
                auVar148._0_4_ = fVar224 * fVar224;
                auVar148._4_4_ = auVar74._4_4_ * auVar74._4_4_;
                auVar148._8_4_ = auVar74._8_4_ * auVar74._8_4_;
                auVar148._12_4_ = auVar74._12_4_ * auVar74._12_4_;
                auVar83 = vsubps_avx512vl(auVar78,auVar148);
                fVar225 = auVar83._0_4_;
                auVar170._4_12_ = ZEXT812(0) << 0x20;
                auVar170._0_4_ = fVar225;
                auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
                auVar85 = vmulss_avx512f(auVar84,ZEXT416(0x3fc00000));
                auVar86 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
                if (fVar225 < 0.0) {
                  local_7b0 = fVar221;
                  fStack_7ac = fVar221;
                  fStack_7a8 = fVar221;
                  fStack_7a4 = fVar221;
                  local_7a0 = auVar84;
                  fVar225 = sqrtf(fVar225);
                  auVar86 = ZEXT416(auVar86._0_4_);
                  auVar85 = ZEXT416(auVar85._0_4_);
                  auVar76 = ZEXT416(auVar76._0_4_);
                  auVar87 = ZEXT416((uint)local_940._0_4_);
                  auVar79 = local_920._0_16_;
                  auVar84 = local_7a0;
                  fVar221 = local_7b0;
                  fVar228 = fStack_7ac;
                  fVar229 = fStack_7a8;
                  fVar237 = fStack_7a4;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  fVar225 = auVar83._0_4_;
                  fVar228 = fVar221;
                  fVar229 = fVar221;
                  fVar237 = fVar221;
                }
                auVar272 = ZEXT1664(auVar74);
                auVar269 = ZEXT1664(auVar79);
                auVar262 = ZEXT1664(auVar80);
                auVar248._8_4_ = 0x7fffffff;
                auVar248._0_8_ = 0x7fffffff7fffffff;
                auVar248._12_4_ = 0x7fffffff;
                auVar274 = ZEXT3264(local_8c0);
                auVar171._0_4_ = (float)local_790._0_4_ * (float)local_880._0_4_;
                auVar171._4_4_ = (float)local_790._0_4_ * (float)local_880._4_4_;
                auVar171._8_4_ = (float)local_790._0_4_ * fStack_878;
                auVar171._12_4_ = (float)local_790._0_4_ * fStack_874;
                auVar190._4_4_ = local_720._0_4_;
                auVar190._0_4_ = local_720._0_4_;
                auVar190._8_4_ = local_720._0_4_;
                auVar190._12_4_ = local_720._0_4_;
                auVar83 = vfmadd132ps_fma(auVar190,auVar171,local_840._0_16_);
                auVar172._4_4_ = local_700._0_4_;
                auVar172._0_4_ = local_700._0_4_;
                auVar172._8_4_ = local_700._0_4_;
                auVar172._12_4_ = local_700._0_4_;
                auVar83 = vfmadd132ps_fma(auVar172,auVar83,local_860._0_16_);
                auVar254 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar254,
                                           ZEXT416(0x40000000));
                auVar191._0_4_ = auVar254._0_4_;
                auVar191._4_4_ = auVar191._0_4_;
                auVar191._8_4_ = auVar191._0_4_;
                auVar191._12_4_ = auVar191._0_4_;
                auVar254 = vfmadd132ps_fma(auVar191,auVar83,local_820._0_16_);
                auVar173._0_4_ = auVar254._0_4_ * fVar236;
                auVar173._4_4_ = auVar254._4_4_ * fVar236;
                auVar173._8_4_ = auVar254._8_4_ * fVar236;
                auVar173._12_4_ = auVar254._12_4_ * fVar236;
                auVar254 = vdpps_avx(auVar79,auVar254,0x7f);
                fVar236 = auVar254._0_4_;
                auVar192._0_4_ = auVar79._0_4_ * fVar236;
                auVar192._4_4_ = auVar79._4_4_ * fVar236;
                auVar192._8_4_ = auVar79._8_4_ * fVar236;
                auVar192._12_4_ = auVar79._12_4_ * fVar236;
                auVar254 = vsubps_avx(auVar173,auVar192);
                local_a00 = auVar82._0_4_;
                local_a00 = auVar81._0_4_ * local_a00;
                auVar25._8_4_ = 0x80000000;
                auVar25._0_8_ = 0x8000000080000000;
                auVar25._12_4_ = 0x80000000;
                auVar131._16_16_ = local_8c0._16_16_;
                auVar83 = vxorps_avx512vl(auVar79,auVar25);
                auVar216._0_4_ = fVar221 * auVar254._0_4_ * local_a00;
                auVar216._4_4_ = fVar228 * auVar254._4_4_ * local_a00;
                auVar216._8_4_ = fVar229 * auVar254._8_4_ * local_a00;
                auVar216._12_4_ = fVar237 * auVar254._12_4_ * local_a00;
                auVar81 = vdpps_avx(auVar83,auVar147,0x7f);
                auVar254 = vmaxss_avx(ZEXT416((uint)fVar247),
                                      ZEXT416((uint)(fVar250 * fVar251 * 1.9073486e-06)));
                auVar76 = vdivss_avx512f(ZEXT416((uint)fVar247),auVar76);
                auVar82 = vdpps_avx(auVar80,auVar216,0x7f);
                auVar87 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar247),auVar254);
                auVar76 = vfmadd213ss_fma(ZEXT416((uint)(fVar227 + 1.0)),auVar76,auVar87);
                auVar270 = ZEXT1664(auVar76);
                auVar87 = vdpps_avx(local_890,auVar147,0x7f);
                fVar236 = auVar81._0_4_ + auVar82._0_4_;
                auVar81 = vdpps_avx(auVar80,auVar83,0x7f);
                auVar83 = vmulss_avx512f(auVar86,auVar84);
                auVar84 = vmulss_avx512f(auVar84,auVar84);
                auVar82 = vdpps_avx(auVar80,local_890,0x7f);
                auVar85 = vaddss_avx512f(auVar85,ZEXT416((uint)(auVar83._0_4_ * auVar84._0_4_)));
                auVar84 = vfnmadd231ss_fma(auVar81,auVar74,ZEXT416((uint)fVar236));
                auVar83 = vfnmadd231ss_fma(auVar82,auVar74,auVar87);
                auVar81 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar225 = fVar225 - auVar81._0_4_;
                auVar81 = vshufps_avx(auVar79,auVar79,0xff);
                auVar82 = vfmsub213ss_fma(auVar84,auVar85,auVar81);
                fVar221 = auVar83._0_4_ * auVar85._0_4_;
                auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar82._0_4_)),
                                          ZEXT416((uint)fVar236),ZEXT416((uint)fVar221));
                fVar227 = auVar84._0_4_;
                fVar226 = fVar226 - (fVar224 * (fVar221 / fVar227) -
                                    fVar225 * (auVar87._0_4_ / fVar227));
                auVar249 = ZEXT464((uint)fVar226);
                fVar250 = fVar250 - (fVar225 * (fVar236 / fVar227) -
                                    fVar224 * (auVar82._0_4_ / fVar227));
                auVar87 = vandps_avx(auVar74,auVar248);
                if (auVar76._0_4_ <= auVar87._0_4_) {
LAB_01b54aaa:
                  bVar11 = false;
                }
                else {
                  auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ + auVar254._0_4_)),
                                            local_7d0,ZEXT416(0x36000000));
                  auVar87 = vandps_avx(auVar248,ZEXT416((uint)fVar225));
                  if (auVar82._0_4_ <= auVar87._0_4_) goto LAB_01b54aaa;
                  fVar250 = fVar250 + (float)local_7c0._0_4_;
                  bVar11 = true;
                  if ((((fVar140 <= fVar250) &&
                       (fVar236 = *(float *)(ray + k * 4 + 0x100), fVar250 <= fVar236)) &&
                      (0.0 <= fVar226)) && (fVar226 <= 1.0)) {
                    auVar131._0_16_ = ZEXT816(0) << 0x20;
                    auVar130._4_28_ = auVar131._4_28_;
                    auVar130._0_4_ = fVar252;
                    auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar130._0_16_);
                    fVar252 = auVar87._0_4_;
                    auVar78 = vmulss_avx512f(auVar78,ZEXT416(0xbf000000));
                    pGVar8 = (context->scene->geometries).items[uVar70].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar252 = fVar252 * 1.5 + auVar78._0_4_ * fVar252 * fVar252 * fVar252;
                      auVar174._0_4_ = auVar80._0_4_ * fVar252;
                      auVar174._4_4_ = auVar80._4_4_ * fVar252;
                      auVar174._8_4_ = auVar80._8_4_ * fVar252;
                      auVar174._12_4_ = auVar80._12_4_ * fVar252;
                      auVar82 = vfmadd213ps_fma(auVar81,auVar174,auVar79);
                      auVar78 = vshufps_avx(auVar174,auVar174,0xc9);
                      auVar87 = vshufps_avx(auVar79,auVar79,0xc9);
                      auVar175._0_4_ = auVar174._0_4_ * auVar87._0_4_;
                      auVar175._4_4_ = auVar174._4_4_ * auVar87._4_4_;
                      auVar175._8_4_ = auVar174._8_4_ * auVar87._8_4_;
                      auVar175._12_4_ = auVar174._12_4_ * auVar87._12_4_;
                      auVar81 = vfmsub231ps_fma(auVar175,auVar79,auVar78);
                      auVar78 = vshufps_avx(auVar81,auVar81,0xc9);
                      auVar87 = vshufps_avx(auVar82,auVar82,0xc9);
                      auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                      auVar149._0_4_ = auVar82._0_4_ * auVar81._0_4_;
                      auVar149._4_4_ = auVar82._4_4_ * auVar81._4_4_;
                      auVar149._8_4_ = auVar82._8_4_ * auVar81._8_4_;
                      auVar149._12_4_ = auVar82._12_4_ * auVar81._12_4_;
                      auVar78 = vfmsub231ps_fma(auVar149,auVar78,auVar87);
                      uVar141 = auVar78._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar250;
                        uVar7 = vextractps_avx(auVar78,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar7;
                        uVar7 = vextractps_avx(auVar78,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar7;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar141;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar226;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar6;
                        *(uint *)(ray + k * 4 + 0x240) = uVar70;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar10 = context->user;
                        auVar194._8_4_ = 1;
                        auVar194._0_8_ = 0x100000001;
                        auVar194._12_4_ = 1;
                        auVar194._16_4_ = 1;
                        auVar194._20_4_ = 1;
                        auVar194._24_4_ = 1;
                        auVar194._28_4_ = 1;
                        auVar89 = vpermps_avx2(auVar194,ZEXT1632(auVar78));
                        auVar209._8_4_ = 2;
                        auVar209._0_8_ = 0x200000002;
                        auVar209._12_4_ = 2;
                        auVar209._16_4_ = 2;
                        auVar209._20_4_ = 2;
                        auVar209._24_4_ = 2;
                        auVar209._28_4_ = 2;
                        local_540 = vpermps_avx2(auVar209,ZEXT1632(auVar78));
                        local_560[0] = (RTCHitN)auVar89[0];
                        local_560[1] = (RTCHitN)auVar89[1];
                        local_560[2] = (RTCHitN)auVar89[2];
                        local_560[3] = (RTCHitN)auVar89[3];
                        local_560[4] = (RTCHitN)auVar89[4];
                        local_560[5] = (RTCHitN)auVar89[5];
                        local_560[6] = (RTCHitN)auVar89[6];
                        local_560[7] = (RTCHitN)auVar89[7];
                        local_560[8] = (RTCHitN)auVar89[8];
                        local_560[9] = (RTCHitN)auVar89[9];
                        local_560[10] = (RTCHitN)auVar89[10];
                        local_560[0xb] = (RTCHitN)auVar89[0xb];
                        local_560[0xc] = (RTCHitN)auVar89[0xc];
                        local_560[0xd] = (RTCHitN)auVar89[0xd];
                        local_560[0xe] = (RTCHitN)auVar89[0xe];
                        local_560[0xf] = (RTCHitN)auVar89[0xf];
                        local_560[0x10] = (RTCHitN)auVar89[0x10];
                        local_560[0x11] = (RTCHitN)auVar89[0x11];
                        local_560[0x12] = (RTCHitN)auVar89[0x12];
                        local_560[0x13] = (RTCHitN)auVar89[0x13];
                        local_560[0x14] = (RTCHitN)auVar89[0x14];
                        local_560[0x15] = (RTCHitN)auVar89[0x15];
                        local_560[0x16] = (RTCHitN)auVar89[0x16];
                        local_560[0x17] = (RTCHitN)auVar89[0x17];
                        local_560[0x18] = (RTCHitN)auVar89[0x18];
                        local_560[0x19] = (RTCHitN)auVar89[0x19];
                        local_560[0x1a] = (RTCHitN)auVar89[0x1a];
                        local_560[0x1b] = (RTCHitN)auVar89[0x1b];
                        local_560[0x1c] = (RTCHitN)auVar89[0x1c];
                        local_560[0x1d] = (RTCHitN)auVar89[0x1d];
                        local_560[0x1e] = (RTCHitN)auVar89[0x1e];
                        local_560[0x1f] = (RTCHitN)auVar89[0x1f];
                        local_520 = uVar141;
                        uStack_51c = uVar141;
                        uStack_518 = uVar141;
                        uStack_514 = uVar141;
                        uStack_510 = uVar141;
                        uStack_50c = uVar141;
                        uStack_508 = uVar141;
                        uStack_504 = uVar141;
                        local_500 = fVar226;
                        fStack_4fc = fVar226;
                        fStack_4f8 = fVar226;
                        fStack_4f4 = fVar226;
                        fStack_4f0 = fVar226;
                        fStack_4ec = fVar226;
                        fStack_4e8 = fVar226;
                        fStack_4e4 = fVar226;
                        local_4e0 = ZEXT432(0) << 0x20;
                        local_4c0 = local_600._0_8_;
                        uStack_4b8 = local_600._8_8_;
                        uStack_4b0 = local_600._16_8_;
                        uStack_4a8 = local_600._24_8_;
                        local_4a0 = local_5e0;
                        auVar89 = vpcmpeqd_avx2(local_5e0,local_5e0);
                        local_8e8[1] = auVar89;
                        *local_8e8 = auVar89;
                        local_480 = pRVar10->instID[0];
                        uStack_47c = local_480;
                        uStack_478 = local_480;
                        uStack_474 = local_480;
                        uStack_470 = local_480;
                        uStack_46c = local_480;
                        uStack_468 = local_480;
                        uStack_464 = local_480;
                        local_460 = pRVar10->instPrimID[0];
                        uStack_45c = local_460;
                        uStack_458 = local_460;
                        uStack_454 = local_460;
                        uStack_450 = local_460;
                        uStack_44c = local_460;
                        uStack_448 = local_460;
                        uStack_444 = local_460;
                        *(float *)(ray + k * 4 + 0x100) = fVar250;
                        local_800 = local_620._0_8_;
                        uStack_7f8 = local_620._8_8_;
                        uStack_7f0 = local_620._16_8_;
                        uStack_7e8 = local_620._24_8_;
                        local_970.valid = (int *)&local_800;
                        local_970.geometryUserPtr = pGVar8->userPtr;
                        local_970.context = context->user;
                        local_970.hit = local_560;
                        local_970.N = 8;
                        local_970.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar262 = ZEXT1664(auVar80);
                          auVar269 = ZEXT1664(auVar79);
                          auVar270 = ZEXT1664(auVar76);
                          auVar272 = ZEXT1664(auVar74);
                          (*pGVar8->intersectionFilterN)(&local_970);
                          auVar249 = ZEXT1664(ZEXT416((uint)fVar226));
                          auVar274 = ZEXT3264(local_8c0);
                        }
                        auVar53._8_8_ = uStack_7f8;
                        auVar53._0_8_ = local_800;
                        auVar53._16_8_ = uStack_7f0;
                        auVar53._24_8_ = uStack_7e8;
                        if (auVar53 != (undefined1  [32])0x0) {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar262 = ZEXT1664(auVar262._0_16_);
                            auVar269 = ZEXT1664(auVar269._0_16_);
                            auVar270 = ZEXT1664(auVar270._0_16_);
                            auVar272 = ZEXT1664(auVar272._0_16_);
                            (*p_Var9)(&local_970);
                            auVar249 = ZEXT1664(ZEXT416((uint)fVar226));
                            auVar274 = ZEXT3264(local_8c0);
                          }
                          auVar54._8_8_ = uStack_7f8;
                          auVar54._0_8_ = local_800;
                          auVar54._16_8_ = uStack_7f0;
                          auVar54._24_8_ = uStack_7e8;
                          if (auVar54 != (undefined1  [32])0x0) {
                            uVar73 = vptestmd_avx512vl(auVar54,auVar54);
                            iVar3 = *(int *)(local_970.hit + 4);
                            iVar4 = *(int *)(local_970.hit + 8);
                            iVar1 = *(int *)(local_970.hit + 0xc);
                            iVar47 = *(int *)(local_970.hit + 0x10);
                            iVar48 = *(int *)(local_970.hit + 0x14);
                            iVar49 = *(int *)(local_970.hit + 0x18);
                            iVar50 = *(int *)(local_970.hit + 0x1c);
                            bVar67 = (byte)uVar73;
                            bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                            bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                            bVar17 = SUB81(uVar73 >> 7,0);
                            *(uint *)(local_970.ray + 0x180) =
                                 (uint)(bVar67 & 1) * *(int *)local_970.hit |
                                 (uint)!(bool)(bVar67 & 1) * *(int *)(local_970.ray + 0x180);
                            *(uint *)(local_970.ray + 0x184) =
                                 (uint)bVar72 * iVar3 |
                                 (uint)!bVar72 * *(int *)(local_970.ray + 0x184);
                            *(uint *)(local_970.ray + 0x188) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_970.ray + 0x188);
                            *(uint *)(local_970.ray + 0x18c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_970.ray + 0x18c);
                            *(uint *)(local_970.ray + 400) =
                                 (uint)bVar15 * iVar47 |
                                 (uint)!bVar15 * *(int *)(local_970.ray + 400);
                            *(uint *)(local_970.ray + 0x194) =
                                 (uint)bVar14 * iVar48 |
                                 (uint)!bVar14 * *(int *)(local_970.ray + 0x194);
                            *(uint *)(local_970.ray + 0x198) =
                                 (uint)bVar16 * iVar49 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x198);
                            *(uint *)(local_970.ray + 0x19c) =
                                 (uint)bVar17 * iVar50 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x19c);
                            iVar3 = *(int *)(local_970.hit + 0x24);
                            iVar4 = *(int *)(local_970.hit + 0x28);
                            iVar1 = *(int *)(local_970.hit + 0x2c);
                            iVar47 = *(int *)(local_970.hit + 0x30);
                            iVar48 = *(int *)(local_970.hit + 0x34);
                            iVar49 = *(int *)(local_970.hit + 0x38);
                            iVar50 = *(int *)(local_970.hit + 0x3c);
                            bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                            bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                            bVar17 = SUB81(uVar73 >> 7,0);
                            *(uint *)(local_970.ray + 0x1a0) =
                                 (uint)(bVar67 & 1) * *(int *)(local_970.hit + 0x20) |
                                 (uint)!(bool)(bVar67 & 1) * *(int *)(local_970.ray + 0x1a0);
                            *(uint *)(local_970.ray + 0x1a4) =
                                 (uint)bVar72 * iVar3 |
                                 (uint)!bVar72 * *(int *)(local_970.ray + 0x1a4);
                            *(uint *)(local_970.ray + 0x1a8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_970.ray + 0x1a8);
                            *(uint *)(local_970.ray + 0x1ac) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_970.ray + 0x1ac);
                            *(uint *)(local_970.ray + 0x1b0) =
                                 (uint)bVar15 * iVar47 |
                                 (uint)!bVar15 * *(int *)(local_970.ray + 0x1b0);
                            *(uint *)(local_970.ray + 0x1b4) =
                                 (uint)bVar14 * iVar48 |
                                 (uint)!bVar14 * *(int *)(local_970.ray + 0x1b4);
                            *(uint *)(local_970.ray + 0x1b8) =
                                 (uint)bVar16 * iVar49 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x1b8);
                            *(uint *)(local_970.ray + 0x1bc) =
                                 (uint)bVar17 * iVar50 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x1bc);
                            iVar3 = *(int *)(local_970.hit + 0x44);
                            iVar4 = *(int *)(local_970.hit + 0x48);
                            iVar1 = *(int *)(local_970.hit + 0x4c);
                            iVar47 = *(int *)(local_970.hit + 0x50);
                            iVar48 = *(int *)(local_970.hit + 0x54);
                            iVar49 = *(int *)(local_970.hit + 0x58);
                            iVar50 = *(int *)(local_970.hit + 0x5c);
                            bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                            bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                            bVar17 = SUB81(uVar73 >> 7,0);
                            *(uint *)(local_970.ray + 0x1c0) =
                                 (uint)(bVar67 & 1) * *(int *)(local_970.hit + 0x40) |
                                 (uint)!(bool)(bVar67 & 1) * *(int *)(local_970.ray + 0x1c0);
                            *(uint *)(local_970.ray + 0x1c4) =
                                 (uint)bVar72 * iVar3 |
                                 (uint)!bVar72 * *(int *)(local_970.ray + 0x1c4);
                            *(uint *)(local_970.ray + 0x1c8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_970.ray + 0x1c8);
                            *(uint *)(local_970.ray + 0x1cc) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_970.ray + 0x1cc);
                            *(uint *)(local_970.ray + 0x1d0) =
                                 (uint)bVar15 * iVar47 |
                                 (uint)!bVar15 * *(int *)(local_970.ray + 0x1d0);
                            *(uint *)(local_970.ray + 0x1d4) =
                                 (uint)bVar14 * iVar48 |
                                 (uint)!bVar14 * *(int *)(local_970.ray + 0x1d4);
                            *(uint *)(local_970.ray + 0x1d8) =
                                 (uint)bVar16 * iVar49 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x1d8);
                            *(uint *)(local_970.ray + 0x1dc) =
                                 (uint)bVar17 * iVar50 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x1dc);
                            iVar3 = *(int *)(local_970.hit + 100);
                            iVar4 = *(int *)(local_970.hit + 0x68);
                            iVar1 = *(int *)(local_970.hit + 0x6c);
                            iVar47 = *(int *)(local_970.hit + 0x70);
                            iVar48 = *(int *)(local_970.hit + 0x74);
                            iVar49 = *(int *)(local_970.hit + 0x78);
                            iVar50 = *(int *)(local_970.hit + 0x7c);
                            bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                            bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                            bVar17 = SUB81(uVar73 >> 7,0);
                            *(uint *)(local_970.ray + 0x1e0) =
                                 (uint)(bVar67 & 1) * *(int *)(local_970.hit + 0x60) |
                                 (uint)!(bool)(bVar67 & 1) * *(int *)(local_970.ray + 0x1e0);
                            *(uint *)(local_970.ray + 0x1e4) =
                                 (uint)bVar72 * iVar3 |
                                 (uint)!bVar72 * *(int *)(local_970.ray + 0x1e4);
                            *(uint *)(local_970.ray + 0x1e8) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_970.ray + 0x1e8);
                            *(uint *)(local_970.ray + 0x1ec) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_970.ray + 0x1ec);
                            *(uint *)(local_970.ray + 0x1f0) =
                                 (uint)bVar15 * iVar47 |
                                 (uint)!bVar15 * *(int *)(local_970.ray + 0x1f0);
                            *(uint *)(local_970.ray + 500) =
                                 (uint)bVar14 * iVar48 |
                                 (uint)!bVar14 * *(int *)(local_970.ray + 500);
                            *(uint *)(local_970.ray + 0x1f8) =
                                 (uint)bVar16 * iVar49 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x1f8);
                            *(uint *)(local_970.ray + 0x1fc) =
                                 (uint)bVar17 * iVar50 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x1fc);
                            iVar3 = *(int *)(local_970.hit + 0x84);
                            iVar4 = *(int *)(local_970.hit + 0x88);
                            iVar1 = *(int *)(local_970.hit + 0x8c);
                            iVar47 = *(int *)(local_970.hit + 0x90);
                            iVar48 = *(int *)(local_970.hit + 0x94);
                            iVar49 = *(int *)(local_970.hit + 0x98);
                            iVar50 = *(int *)(local_970.hit + 0x9c);
                            bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
                            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
                            bVar15 = (bool)((byte)(uVar73 >> 4) & 1);
                            bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                            bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                            bVar17 = SUB81(uVar73 >> 7,0);
                            *(uint *)(local_970.ray + 0x200) =
                                 (uint)(bVar67 & 1) * *(int *)(local_970.hit + 0x80) |
                                 (uint)!(bool)(bVar67 & 1) * *(int *)(local_970.ray + 0x200);
                            *(uint *)(local_970.ray + 0x204) =
                                 (uint)bVar72 * iVar3 |
                                 (uint)!bVar72 * *(int *)(local_970.ray + 0x204);
                            *(uint *)(local_970.ray + 0x208) =
                                 (uint)bVar12 * iVar4 |
                                 (uint)!bVar12 * *(int *)(local_970.ray + 0x208);
                            *(uint *)(local_970.ray + 0x20c) =
                                 (uint)bVar13 * iVar1 |
                                 (uint)!bVar13 * *(int *)(local_970.ray + 0x20c);
                            *(uint *)(local_970.ray + 0x210) =
                                 (uint)bVar15 * iVar47 |
                                 (uint)!bVar15 * *(int *)(local_970.ray + 0x210);
                            *(uint *)(local_970.ray + 0x214) =
                                 (uint)bVar14 * iVar48 |
                                 (uint)!bVar14 * *(int *)(local_970.ray + 0x214);
                            *(uint *)(local_970.ray + 0x218) =
                                 (uint)bVar16 * iVar49 |
                                 (uint)!bVar16 * *(int *)(local_970.ray + 0x218);
                            *(uint *)(local_970.ray + 0x21c) =
                                 (uint)bVar17 * iVar50 |
                                 (uint)!bVar17 * *(int *)(local_970.ray + 0x21c);
                            auVar89 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0xa0));
                            *(undefined1 (*) [32])(local_970.ray + 0x220) = auVar89;
                            auVar89 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0xc0));
                            *(undefined1 (*) [32])(local_970.ray + 0x240) = auVar89;
                            auVar89 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0xe0));
                            *(undefined1 (*) [32])(local_970.ray + 0x260) = auVar89;
                            auVar89 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                          (local_970.hit + 0x100));
                            *(undefined1 (*) [32])(local_970.ray + 0x280) = auVar89;
                            goto LAB_01b54aad;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar236;
                      }
                    }
                  }
                }
LAB_01b54aad:
                bVar72 = lVar71 != 0;
                lVar71 = lVar71 + -1;
              } while ((!bVar11) && (bVar72));
              auVar56._4_4_ = fStack_69c;
              auVar56._0_4_ = local_6a0;
              auVar56._8_4_ = fStack_698;
              auVar56._12_4_ = fStack_694;
              auVar56._16_4_ = fStack_690;
              auVar56._20_4_ = fStack_68c;
              auVar56._24_4_ = fStack_688;
              auVar56._28_4_ = fStack_684;
              uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar36._4_4_ = uVar141;
              auVar36._0_4_ = uVar141;
              auVar36._8_4_ = uVar141;
              auVar36._12_4_ = uVar141;
              auVar36._16_4_ = uVar141;
              auVar36._20_4_ = uVar141;
              auVar36._24_4_ = uVar141;
              auVar36._28_4_ = uVar141;
              uVar18 = vcmpps_avx512vl(auVar56,auVar36,2);
              bVar68 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar68 & (byte)uVar18;
            } while (bVar68 != 0);
          }
          uVar19 = vpcmpd_avx512vl(local_5c0,_local_6c0,1);
          uVar20 = vpcmpd_avx512vl(local_5c0,local_400,1);
          auVar176._0_4_ = (float)local_740._0_4_ + (float)local_1c0._0_4_;
          auVar176._4_4_ = (float)local_740._4_4_ + (float)local_1c0._4_4_;
          auVar176._8_4_ = fStack_738 + fStack_1b8;
          auVar176._12_4_ = fStack_734 + fStack_1b4;
          auVar176._16_4_ = fStack_730 + fStack_1b0;
          auVar176._20_4_ = fStack_72c + fStack_1ac;
          auVar176._24_4_ = fStack_728 + fStack_1a8;
          auVar176._28_4_ = fStack_724 + fStack_1a4;
          uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar195._4_4_ = uVar141;
          auVar195._0_4_ = uVar141;
          auVar195._8_4_ = uVar141;
          auVar195._12_4_ = uVar141;
          auVar195._16_4_ = uVar141;
          auVar195._20_4_ = uVar141;
          auVar195._24_4_ = uVar141;
          auVar195._28_4_ = uVar141;
          uVar18 = vcmpps_avx512vl(auVar176,auVar195,2);
          bVar65 = bVar65 & (byte)uVar20 & (byte)uVar18;
          auVar210._0_4_ = (float)local_740._0_4_ + (float)local_440._0_4_;
          auVar210._4_4_ = (float)local_740._4_4_ + (float)local_440._4_4_;
          auVar210._8_4_ = fStack_738 + fStack_438;
          auVar210._12_4_ = fStack_734 + fStack_434;
          auVar210._16_4_ = fStack_730 + fStack_430;
          auVar210._20_4_ = fStack_72c + fStack_42c;
          auVar210._24_4_ = fStack_728 + fStack_428;
          auVar210._28_4_ = fStack_724 + fStack_424;
          uVar18 = vcmpps_avx512vl(auVar210,auVar195,2);
          bVar61 = bVar61 & (byte)uVar19 & (byte)uVar18 | bVar65;
          prim = local_8e0;
          if (bVar61 != 0) {
            uVar73 = local_8d0 & 0xffffffff;
            abStack_180[uVar73 * 0x60] = bVar61;
            bVar11 = (bool)(bVar65 >> 1 & 1);
            bVar72 = (bool)(bVar65 >> 2 & 1);
            bVar12 = (bool)(bVar65 >> 3 & 1);
            bVar13 = (bool)(bVar65 >> 4 & 1);
            bVar15 = (bool)(bVar65 >> 5 & 1);
            auStack_160[uVar73 * 0x18] =
                 (uint)(bVar65 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar65 & 1) * local_440._0_4_;
            auStack_160[uVar73 * 0x18 + 1] =
                 (uint)bVar11 * local_1c0._4_4_ | (uint)!bVar11 * local_440._4_4_;
            auStack_160[uVar73 * 0x18 + 2] =
                 (uint)bVar72 * (int)fStack_1b8 | (uint)!bVar72 * (int)fStack_438;
            auStack_160[uVar73 * 0x18 + 3] =
                 (uint)bVar12 * (int)fStack_1b4 | (uint)!bVar12 * (int)fStack_434;
            auStack_160[uVar73 * 0x18 + 4] =
                 (uint)bVar13 * (int)fStack_1b0 | (uint)!bVar13 * (int)fStack_430;
            auStack_160[uVar73 * 0x18 + 5] =
                 (uint)bVar15 * (int)fStack_1ac | (uint)!bVar15 * (int)fStack_42c;
            auStack_160[uVar73 * 0x18 + 6] =
                 (uint)(bVar65 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar65 >> 6) * (int)fStack_428;
            (&fStack_144)[uVar73 * 0x18] = fStack_424;
            uVar18 = vmovlps_avx(auVar182);
            (&uStack_140)[uVar73 * 0xc] = uVar18;
            afStack_138[uVar73 * 0x18] = (float)((int)local_8d8 + 1);
            local_8d0 = (ulong)((int)local_8d0 + 1);
            auVar249 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
            auVar255 = ZEXT3264(_DAT_02020f20);
            auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar275 = ZEXT3264(auVar89);
            goto LAB_01b54ee8;
          }
          auVar235._8_4_ = 0x7fffffff;
          auVar235._0_8_ = 0x7fffffff7fffffff;
          auVar235._12_4_ = 0x7fffffff;
          auVar235._16_4_ = 0x7fffffff;
          auVar235._20_4_ = 0x7fffffff;
          auVar235._24_4_ = 0x7fffffff;
          auVar235._28_4_ = 0x7fffffff;
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        }
        auVar255 = ZEXT3264(_DAT_02020f20);
        auVar275 = ZEXT3264(auVar89);
        auVar249 = ZEXT3264(auVar235);
      }
    }
LAB_01b54ee8:
    auVar196 = ZEXT1664(auVar182);
    local_8d0 = local_8d0 & 0xffffffff;
    do {
      if ((int)local_8d0 == 0) {
        uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar26._4_4_ = uVar141;
        auVar26._0_4_ = uVar141;
        auVar26._8_4_ = uVar141;
        auVar26._12_4_ = uVar141;
        uVar18 = vcmpps_avx512vl(local_630,auVar26,2);
        uVar70 = (uint)local_8c8 & (uint)uVar18;
        local_8c8 = (ulong)uVar70;
        if (uVar70 == 0) {
          return;
        }
        goto LAB_01b52608;
      }
      uVar73 = (ulong)((int)local_8d0 - 1);
      auVar89 = *(undefined1 (*) [32])(auStack_160 + uVar73 * 0x18);
      auVar177._0_4_ = auVar89._0_4_ + (float)local_740._0_4_;
      auVar177._4_4_ = auVar89._4_4_ + (float)local_740._4_4_;
      auVar177._8_4_ = auVar89._8_4_ + fStack_738;
      auVar177._12_4_ = auVar89._12_4_ + fStack_734;
      auVar177._16_4_ = auVar89._16_4_ + fStack_730;
      auVar177._20_4_ = auVar89._20_4_ + fStack_72c;
      auVar177._24_4_ = auVar89._24_4_ + fStack_728;
      auVar177._28_4_ = auVar89._28_4_ + fStack_724;
      uVar141 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar37._4_4_ = uVar141;
      auVar37._0_4_ = uVar141;
      auVar37._8_4_ = uVar141;
      auVar37._12_4_ = uVar141;
      auVar37._16_4_ = uVar141;
      auVar37._20_4_ = uVar141;
      auVar37._24_4_ = uVar141;
      auVar37._28_4_ = uVar141;
      uVar18 = vcmpps_avx512vl(auVar177,auVar37,2);
      uVar66 = (uint)uVar18 & (uint)abStack_180[uVar73 * 0x60];
      bVar61 = (byte)uVar66;
      if (uVar66 != 0) {
        auVar178._8_4_ = 0x7f800000;
        auVar178._0_8_ = 0x7f8000007f800000;
        auVar178._12_4_ = 0x7f800000;
        auVar178._16_4_ = 0x7f800000;
        auVar178._20_4_ = 0x7f800000;
        auVar178._24_4_ = 0x7f800000;
        auVar178._28_4_ = 0x7f800000;
        auVar90 = vblendmps_avx512vl(auVar178,auVar89);
        auVar132._0_4_ =
             (uint)(bVar61 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)auVar89._0_4_;
        bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar11 * auVar90._4_4_ | (uint)!bVar11 * (int)auVar89._4_4_;
        bVar11 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar11 * auVar90._8_4_ | (uint)!bVar11 * (int)auVar89._8_4_;
        bVar11 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar11 * auVar90._12_4_ | (uint)!bVar11 * (int)auVar89._12_4_;
        bVar11 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar132._16_4_ = (uint)bVar11 * auVar90._16_4_ | (uint)!bVar11 * (int)auVar89._16_4_;
        bVar11 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar132._20_4_ = (uint)bVar11 * auVar90._20_4_ | (uint)!bVar11 * (int)auVar89._20_4_;
        bVar11 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar132._24_4_ = (uint)bVar11 * auVar90._24_4_ | (uint)!bVar11 * (int)auVar89._24_4_;
        auVar132._28_4_ =
             (uVar66 >> 7) * auVar90._28_4_ | (uint)!SUB41(uVar66 >> 7,0) * (int)auVar89._28_4_;
        auVar89 = vshufps_avx(auVar132,auVar132,0xb1);
        auVar89 = vminps_avx(auVar132,auVar89);
        auVar90 = vshufpd_avx(auVar89,auVar89,5);
        auVar89 = vminps_avx(auVar89,auVar90);
        auVar90 = vpermpd_avx2(auVar89,0x4e);
        auVar89 = vminps_avx(auVar89,auVar90);
        uVar18 = vcmpps_avx512vl(auVar132,auVar89,0);
        bVar68 = (byte)uVar18 & bVar61;
        if (bVar68 != 0) {
          uVar66 = (uint)bVar68;
        }
        fVar247 = afStack_138[uVar73 * 0x18 + -1];
        uVar133 = 0;
        for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
          uVar133 = uVar133 + 1;
        }
        local_8d8 = (ulong)(uint)afStack_138[uVar73 * 0x18];
        bVar68 = ~('\x01' << ((byte)uVar133 & 0x1f)) & bVar61;
        abStack_180[uVar73 * 0x60] = bVar68;
        uVar64 = uVar73;
        if (bVar68 != 0) {
          uVar64 = local_8d0;
        }
        fVar250 = *(float *)(&uStack_140 + uVar73 * 0xc);
        auVar179._4_4_ = fVar250;
        auVar179._0_4_ = fVar250;
        auVar179._8_4_ = fVar250;
        auVar179._12_4_ = fVar250;
        auVar179._16_4_ = fVar250;
        auVar179._20_4_ = fVar250;
        auVar179._24_4_ = fVar250;
        auVar179._28_4_ = fVar250;
        fVar247 = fVar247 - fVar250;
        auVar159._4_4_ = fVar247;
        auVar159._0_4_ = fVar247;
        auVar159._8_4_ = fVar247;
        auVar159._12_4_ = fVar247;
        auVar159._16_4_ = fVar247;
        auVar159._20_4_ = fVar247;
        auVar159._24_4_ = fVar247;
        auVar159._28_4_ = fVar247;
        auVar78 = vfmadd132ps_fma(auVar159,auVar179,auVar255._0_32_);
        auVar89 = ZEXT1632(auVar78);
        local_560[0] = (RTCHitN)auVar89[0];
        local_560[1] = (RTCHitN)auVar89[1];
        local_560[2] = (RTCHitN)auVar89[2];
        local_560[3] = (RTCHitN)auVar89[3];
        local_560[4] = (RTCHitN)auVar89[4];
        local_560[5] = (RTCHitN)auVar89[5];
        local_560[6] = (RTCHitN)auVar89[6];
        local_560[7] = (RTCHitN)auVar89[7];
        local_560[8] = (RTCHitN)auVar89[8];
        local_560[9] = (RTCHitN)auVar89[9];
        local_560[10] = (RTCHitN)auVar89[10];
        local_560[0xb] = (RTCHitN)auVar89[0xb];
        local_560[0xc] = (RTCHitN)auVar89[0xc];
        local_560[0xd] = (RTCHitN)auVar89[0xd];
        local_560[0xe] = (RTCHitN)auVar89[0xe];
        local_560[0xf] = (RTCHitN)auVar89[0xf];
        local_560[0x10] = (RTCHitN)auVar89[0x10];
        local_560[0x11] = (RTCHitN)auVar89[0x11];
        local_560[0x12] = (RTCHitN)auVar89[0x12];
        local_560[0x13] = (RTCHitN)auVar89[0x13];
        local_560[0x14] = (RTCHitN)auVar89[0x14];
        local_560[0x15] = (RTCHitN)auVar89[0x15];
        local_560[0x16] = (RTCHitN)auVar89[0x16];
        local_560[0x17] = (RTCHitN)auVar89[0x17];
        local_560[0x18] = (RTCHitN)auVar89[0x18];
        local_560[0x19] = (RTCHitN)auVar89[0x19];
        local_560[0x1a] = (RTCHitN)auVar89[0x1a];
        local_560[0x1b] = (RTCHitN)auVar89[0x1b];
        local_560[0x1c] = (RTCHitN)auVar89[0x1c];
        local_560[0x1d] = (RTCHitN)auVar89[0x1d];
        local_560[0x1e] = (RTCHitN)auVar89[0x1e];
        local_560[0x1f] = (RTCHitN)auVar89[0x1f];
        auVar196 = ZEXT864(*(ulong *)(local_560 + (ulong)uVar133 * 4));
        uVar73 = uVar64;
      }
      local_8d0 = uVar73;
    } while (bVar61 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }